

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void rollback_to_zero_after_compact_test(bool multi_kv)

{
  bool bVar1;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  __atomic_base<unsigned_long> metalen;
  long extraout_RDX;
  code *pcVar8;
  long lVar9;
  fdb_doc *ptr_handle;
  timeval *__tv;
  fdb_config *fconfig_00;
  fdb_kvs_handle **ppfVar10;
  uint uVar11;
  uint uVar12;
  char *pcVar13;
  char *__s;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_handle *pfVar15;
  fdb_kvs_handle *pfVar16;
  fdb_kvs_handle *pfVar17;
  undefined7 in_register_00000039;
  fdb_doc **ppfVar18;
  fdb_kvs_handle **ppfVar19;
  fdb_kvs_handle *unaff_R12;
  fdb_kvs_handle *unaff_R13;
  ulong uVar20;
  btree *doc_00;
  char *pcVar21;
  fdb_kvs_config *config;
  filemgr_ops *pfVar22;
  fdb_config *fconfig_01;
  fdb_kvs_handle **__s_00;
  btree **__s_01;
  fdb_doc **doc_01;
  fdb_kvs_handle *doc_02;
  fdb_kvs_handle *pfVar23;
  fdb_file_handle *dbfile;
  fdb_file_handle *dbfile_comp;
  fdb_kvs_handle *db [4];
  fdb_kvs_info info;
  char metabuf [64];
  char keybuf [64];
  fdb_kvs_config kvs_config;
  char kv_name [8];
  char bodybuf [64];
  timeval __test_begin;
  fdb_doc *doc [20];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_4a18;
  fdb_kvs_handle *pfStack_4a10;
  fdb_file_handle *pfStack_4a08;
  fdb_iterator *pfStack_4a00;
  fdb_doc *pfStack_49f8;
  fdb_kvs_handle *pfStack_49f0;
  timeval tStack_49e8;
  fdb_kvs_config fStack_49d8;
  fdb_config fStack_49c0;
  fdb_config *pfStack_48c8;
  fdb_kvs_handle *pfStack_48c0;
  fdb_kvs_handle *pfStack_48b8;
  fdb_file_handle *pfStack_48b0;
  fdb_kvs_handle *pfStack_48a8;
  char acStack_489f [15];
  filemgr *pfStack_4890;
  docio_handle *pdStack_4888;
  btreeblk_handle *pbStack_4880;
  size_t sStack_4878;
  filemgr *pfStack_4870;
  docio_handle *pdStack_4868;
  btreeblk_handle *pbStack_4860;
  timeval tStack_4858;
  undefined1 auStack_4848 [76];
  uint uStack_47fc;
  char *pcStack_4708;
  atomic<unsigned_long> aStack_4700;
  btree *pbStack_46f8;
  fdb_kvs_handle *pfStack_46f0;
  fdb_kvs_handle *pfStack_46e8;
  code *pcStack_46e0;
  uint uStack_46cc;
  fdb_txn *pfStack_46c8;
  fdb_kvs_handle *pfStack_46c0;
  fdb_iterator *pfStack_46b8;
  fdb_snapshot_info_t *pfStack_46b0;
  int iStack_46a4;
  fdb_kvs_handle *pfStack_46a0;
  fdb_kvs_handle *apfStack_4698 [3];
  uint64_t uStack_4680;
  fdb_kvs_config fStack_4678;
  char acStack_4660 [8];
  timeval tStack_4658;
  char acStack_4648 [256];
  btree bStack_4548;
  char acStack_44f8 [256];
  char acStack_43f8 [256];
  fdb_config fStack_42f8;
  fdb_kvs_handle **ppfStack_4200;
  fdb_kvs_handle **ppfStack_41f8;
  fdb_kvs_handle *pfStack_41f0;
  fdb_kvs_handle **ppfStack_41e8;
  fdb_kvs_handle *pfStack_41e0;
  code *pcStack_41d8;
  fdb_kvs_handle **ppfStack_41d0;
  fdb_kvs_handle *pfStack_41c8;
  fdb_kvs_handle *apfStack_41c0 [9];
  fdb_kvs_config fStack_4178;
  timeval tStack_4160;
  fdb_kvs_handle *apfStack_4150 [33];
  fdb_config fStack_4048;
  fdb_kvs_handle *apfStack_3f50 [32];
  fdb_kvs_handle *apfStack_3e50 [32];
  fdb_kvs_handle afStack_3d50 [15];
  fdb_config *pfStack_1d48;
  fdb_kvs_handle *pfStack_1d40;
  fdb_kvs_handle *pfStack_1d38;
  fdb_config *pfStack_1d30;
  fdb_kvs_handle *pfStack_1d28;
  fdb_kvs_handle *pfStack_1d20;
  fdb_kvs_handle *pfStack_1d10;
  fdb_file_handle *pfStack_1d08;
  fdb_iterator *pfStack_1d00;
  fdb_doc *pfStack_1cf8;
  fdb_kvs_handle *pfStack_1cf0;
  undefined1 auStack_1ce7 [31];
  undefined1 auStack_1cc8 [72];
  fdb_config fStack_1c80;
  timeval *ptStack_1b88;
  fdb_kvs_handle *pfStack_1b80;
  fdb_kvs_handle *pfStack_1b78;
  fdb_config *pfStack_1b70;
  fdb_kvs_handle *pfStack_1b68;
  fdb_kvs_handle *pfStack_1b58;
  fdb_file_handle *pfStack_1b50;
  undefined4 uStack_1b44;
  pthread_t pStack_1b40;
  undefined1 auStack_1b37 [63];
  undefined1 auStack_1af8 [16];
  uint64_t uStack_1ae8;
  fdb_config fStack_1a00;
  fdb_kvs_handle *pfStack_1900;
  fdb_kvs_handle *pfStack_18f8;
  filemgr_ops *pfStack_18f0;
  fdb_kvs_handle *pfStack_18e8;
  fdb_kvs_handle *pfStack_18e0;
  timeval tStack_18d0;
  fdb_kvs_handle *pfStack_18c0;
  fdb_kvs_handle *pfStack_18b8;
  fdb_kvs_handle *pfStack_18a8;
  fdb_kvs_handle *pfStack_18a0;
  fdb_kvs_handle *pfStack_1898;
  fdb_file_handle *pfStack_1890;
  undefined1 auStack_1884 [12];
  kvs_ops_stat *pkStack_1878;
  atomic<unsigned_long> aStack_1870;
  timeval tStack_1840;
  __atomic_base<unsigned_long> _Stack_1830;
  kvs_ops_stat *pkStack_1828;
  __atomic_base<unsigned_long> _Stack_1820;
  fdb_kvs_info fStack_1810;
  undefined1 uStack_17c0;
  undefined1 uStack_17b2;
  btree *pbStack_17a8;
  code *pcStack_1788;
  uint8_t auStack_1780 [8];
  filemgr_ops *pfStack_1778;
  fdb_kvs_handle *pfStack_16e8;
  fdb_kvs_handle *pfStack_16e0;
  fdb_kvs_handle *pfStack_16d8;
  fdb_txn *pfStack_16d0;
  fdb_kvs_handle *pfStack_16c8;
  fdb_kvs_handle *pfStack_16c0;
  fdb_file_handle *pfStack_16b0;
  int iStack_16a4;
  fdb_kvs_handle *pfStack_16a0;
  fdb_kvs_handle *pfStack_1698;
  undefined1 auStack_1690 [48];
  __atomic_base<unsigned_long> _Stack_1660;
  undefined1 auStack_1658 [32];
  fdb_kvs_info fStack_1638;
  timeval tStack_1608;
  undefined1 auStack_15f8 [160];
  char acStack_1558 [256];
  char acStack_1458 [256];
  fdb_kvs_handle fStack_1358;
  fdb_kvs_handle *pfStack_1150;
  fdb_kvs_config *pfStack_1148;
  fdb_doc **ppfStack_1140;
  code *pcStack_1138;
  undefined1 auStack_1120 [72];
  fdb_kvs_config fStack_10d8;
  fdb_doc afStack_10c0 [3];
  char acStack_fc0 [256];
  char acStack_ec0 [264];
  fdb_config fStack_db8;
  fdb_doc *pfStack_cc0;
  size_t *psStack_cb8;
  fdb_doc *apfStack_810 [151];
  fdb_kvs_handle *pfStack_358;
  fdb_kvs_handle *pfStack_350;
  fdb_kvs_handle *pfStack_348;
  char *pcStack_340;
  btree **ppbStack_338;
  code *pcStack_330;
  fdb_kvs_handle *local_320;
  int local_314;
  fdb_kvs_handle *local_310;
  undefined1 local_308 [40];
  hbtrie *local_2e0;
  btree *local_2d8 [2];
  filemgr *local_2c8 [2];
  char local_2b8 [64];
  char local_278 [64];
  undefined1 local_238 [112];
  fdb_doc *local_1c8;
  snap_handle *local_120;
  uint64_t local_118;
  undefined4 local_104;
  undefined1 local_f9;
  undefined1 local_e8;
  
  pcStack_330 = (code *)0x11a4c1;
  gettimeofday((timeval *)(local_238 + 0x60),(__timezone_ptr_t)0x0);
  pcStack_330 = (code *)0x11a4cd;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_330 = (code *)0x11a4dd;
  fdb_get_default_config();
  pcStack_330 = (code *)0x11a4ea;
  fdb_get_default_kvs_config();
  local_120 = (snap_handle *)0x0;
  local_118 = 0x400;
  local_104 = 1;
  local_f9 = 0;
  pcStack_330 = (code *)0x11a51d;
  local_e8 = multi_kv;
  fdb_open((fdb_file_handle **)&local_320,"./mvcc_test1",(fdb_config *)&stack0xfffffffffffffed8);
  local_314 = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_314 == 0) {
    pcStack_330 = (code *)0x11a592;
    fdb_kvs_open_default
              ((fdb_file_handle *)local_320,(fdb_kvs_handle **)local_308,(fdb_kvs_config *)local_238
              );
    pcVar13 = (char *)0x1;
  }
  else {
    ppfVar10 = (fdb_kvs_handle **)local_308;
    unaff_R12 = (fdb_kvs_handle *)local_238;
    uVar20 = 0;
    do {
      pcStack_330 = (code *)0x11a554;
      sprintf(local_238 + 0x18,"kv%d",uVar20 & 0xffffffff);
      pcStack_330 = (code *)0x11a567;
      fdb_kvs_open((fdb_file_handle *)local_320,ppfVar10,local_238 + 0x18,
                   (fdb_kvs_config *)unaff_R12);
      uVar20 = uVar20 + 1;
      ppfVar10 = ppfVar10 + 1;
    } while (uVar20 != 4);
    pcVar13 = (char *)0x4;
    unaff_R13 = (fdb_kvs_handle *)0x4;
  }
  __s_01 = (btree **)0x0;
  pcVar8 = logCallbackFunc;
  pcVar21 = "rollback_to_zero_after_compact_test";
  do {
    pfVar14 = *(fdb_kvs_handle **)(local_308 + (long)__s_01 * 8);
    pcStack_330 = (code *)0x11a5b8;
    fVar2 = fdb_set_log_callback(pfVar14,logCallbackFunc,"rollback_to_zero_after_compact_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_330 = (code *)0x11aacb;
      rollback_to_zero_after_compact_test();
      goto LAB_0011aacb;
    }
    __s_01 = (btree **)((long)__s_01 + 1);
  } while ((btree **)pcVar13 != __s_01);
  uVar20 = 0;
  do {
    pcStack_330 = (code *)0x11a5e7;
    sprintf(local_278,"key%d",uVar20 & 0xffffffff);
    pcStack_330 = (code *)0x11a5fd;
    sprintf(local_2b8,"meta%d",uVar20 & 0xffffffff);
    pcStack_330 = (code *)0x11a616;
    sprintf(local_238 + 0x20,"body%d",uVar20 & 0xffffffff);
    pcStack_330 = (code *)0x11a629;
    sVar5 = strlen(local_278);
    pcStack_330 = (code *)0x11a639;
    sVar6 = strlen(local_2b8);
    pcStack_330 = (code *)0x11a649;
    sVar7 = strlen(local_238 + 0x20);
    pcStack_330 = (code *)0x11a66e;
    fdb_doc_create((fdb_doc **)((long)&stack0xfffffffffffffe38 + uVar20 * 8),local_278,sVar5,
                   local_2b8,sVar6,local_238 + 0x20,sVar7);
    lVar9 = 0;
    do {
      pcStack_330 = (code *)0x11a67f;
      fdb_set(*(fdb_kvs_handle **)(local_308 + lVar9 * 8),
              *(fdb_doc **)((long)&stack0xfffffffffffffe38 + uVar20 * 8));
      lVar9 = lVar9 + 1;
    } while (pcVar13 != (char *)lVar9);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 5);
  pcStack_330 = (code *)0x11a6a3;
  fdb_commit((fdb_file_handle *)local_320,'\x01');
  uVar20 = 5;
  do {
    pcStack_330 = (code *)0x11a6c5;
    sprintf(local_278,"key%d",uVar20 & 0xffffffff);
    pcStack_330 = (code *)0x11a6de;
    sprintf(local_2b8,"meta%d",uVar20 & 0xffffffff);
    pcVar21 = local_238 + 0x20;
    pcStack_330 = (code *)0x11a6fa;
    sprintf(pcVar21,"body%d",uVar20 & 0xffffffff);
    pcStack_330 = (code *)0x11a70d;
    sVar5 = strlen(local_278);
    pcStack_330 = (code *)0x11a718;
    sVar6 = strlen(local_2b8);
    pcStack_330 = (code *)0x11a723;
    sVar7 = strlen(pcVar21);
    pcStack_330 = (code *)0x11a745;
    fdb_doc_create((fdb_doc **)((long)&stack0xfffffffffffffe38 + uVar20 * 8),local_278,sVar5,
                   local_2b8,sVar6,pcVar21,sVar7);
    lVar9 = 0;
    do {
      pcStack_330 = (code *)0x11a755;
      fdb_set(*(fdb_kvs_handle **)(local_308 + lVar9 * 8),
              *(fdb_doc **)((long)&stack0xfffffffffffffe38 + uVar20 * 8));
      lVar9 = lVar9 + 1;
    } while (pcVar13 != (char *)lVar9);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 10);
  pcStack_330 = (code *)0x11a776;
  fdb_commit((fdb_file_handle *)local_320,'\0');
  uVar20 = 10;
  do {
    pcStack_330 = (code *)0x11a798;
    sprintf(local_278,"key%d",uVar20 & 0xffffffff);
    pcStack_330 = (code *)0x11a7b1;
    sprintf(local_2b8,"meta%d",uVar20 & 0xffffffff);
    pcVar21 = local_238 + 0x20;
    pcStack_330 = (code *)0x11a7cd;
    sprintf(pcVar21,"body%d",uVar20 & 0xffffffff);
    pcStack_330 = (code *)0x11a7e0;
    sVar5 = strlen(local_278);
    pcStack_330 = (code *)0x11a7eb;
    sVar6 = strlen(local_2b8);
    pcStack_330 = (code *)0x11a7f6;
    sVar7 = strlen(pcVar21);
    pcStack_330 = (code *)0x11a818;
    fdb_doc_create((fdb_doc **)((long)&stack0xfffffffffffffe38 + uVar20 * 8),local_278,sVar5,
                   local_2b8,sVar6,pcVar21,sVar7);
    lVar9 = 0;
    do {
      pcStack_330 = (code *)0x11a828;
      fdb_set(*(fdb_kvs_handle **)(local_308 + lVar9 * 8),
              *(fdb_doc **)((long)&stack0xfffffffffffffe38 + uVar20 * 8));
      lVar9 = lVar9 + 1;
    } while (pcVar13 != (char *)lVar9);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 0xf);
  pcStack_330 = (code *)0x11a84c;
  fdb_commit((fdb_file_handle *)local_320,'\x01');
  uVar20 = 0xf;
  do {
    pcStack_330 = (code *)0x11a86e;
    sprintf(local_278,"key%d",uVar20 & 0xffffffff);
    pcStack_330 = (code *)0x11a887;
    sprintf(local_2b8,"meta%d",uVar20 & 0xffffffff);
    __s_01 = (btree **)(local_238 + 0x20);
    pcStack_330 = (code *)0x11a8a3;
    sprintf((char *)__s_01,"body%d",uVar20 & 0xffffffff);
    unaff_R13 = (fdb_kvs_handle *)((long)&stack0xfffffffffffffe38 + uVar20 * 8);
    pcStack_330 = (code *)0x11a8b6;
    sVar5 = strlen(local_278);
    pcStack_330 = (code *)0x11a8c1;
    unaff_R12 = (fdb_kvs_handle *)strlen(local_2b8);
    pcStack_330 = (code *)0x11a8cc;
    sVar6 = strlen((char *)__s_01);
    pcStack_330 = (code *)0x11a8ee;
    fdb_doc_create((fdb_doc **)unaff_R13,local_278,sVar5,local_2b8,(size_t)unaff_R12,__s_01,sVar6);
    pcVar8 = (code *)0x0;
    do {
      pcStack_330 = (code *)0x11a8fe;
      fdb_set(*(fdb_kvs_handle **)(local_308 + (long)pcVar8 * 8),*(fdb_doc **)&unaff_R13->kvs_config
             );
      pcVar8 = (code *)((long)pcVar8 + 1);
    } while ((code *)pcVar13 != pcVar8);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 0x14);
  pcStack_330 = (code *)0x11a91f;
  fdb_commit((fdb_file_handle *)local_320,'\0');
  pfVar14 = (fdb_kvs_handle *)&local_310;
  pcStack_330 = (code *)0x11a938;
  fVar2 = fdb_open((fdb_file_handle **)pfVar14,"./mvcc_test1",(fdb_config *)&stack0xfffffffffffffed8
                  );
  pcVar21 = (char *)0x14;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aadf;
  pcStack_330 = (code *)0x11a951;
  pfVar14 = local_310;
  fVar2 = fdb_compact((fdb_file_handle *)local_310,"./mvcc_test2");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aae4;
  pcStack_330 = (code *)0x11a963;
  fdb_close((fdb_file_handle *)local_310);
  __s_01 = local_2d8;
  unaff_R12 = (fdb_kvs_handle *)local_2c8;
  pcVar13 = (char *)(ulong)(uint)((int)pcVar13 << 3);
  pcVar21 = (char *)0x0;
  unaff_R13 = (fdb_kvs_handle *)(local_308 + 0x20);
  do {
    pcVar8 = (code *)(local_308 + (long)pcVar21);
    pcStack_330 = (code *)0x11a98a;
    pfVar14 = (fdb_kvs_handle *)pcVar8;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar8,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aad0;
    pfVar14 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar8)->kvs_config;
    pcStack_330 = (code *)0x11a99d;
    fVar2 = fdb_get_kvs_info(pfVar14,(fdb_kvs_info *)unaff_R13);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aacb;
    if (local_2e0 != (hbtrie *)0x0) {
      pcStack_330 = (code *)0x11aa03;
      rollback_to_zero_after_compact_test();
    }
    if (local_2d8[0] != (btree *)0x0) {
      pcStack_330 = (code *)0x11aa0d;
      rollback_to_zero_after_compact_test();
    }
    if (local_2c8[0] != (filemgr *)0x0) {
      pcStack_330 = (code *)0x11aa17;
      rollback_to_zero_after_compact_test();
    }
    pfVar14 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar8)->kvs_config;
    pcStack_330 = (code *)0x11a9cd;
    fVar2 = fdb_get(pfVar14,local_1c8);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011aada;
    pfVar14 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar8)->kvs_config;
    pcStack_330 = (code *)0x11a9e6;
    fVar2 = fdb_set(pfVar14,local_1c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aad5;
    pcVar21 = pcVar21 + 8;
  } while (pcVar13 != pcVar21);
  pcStack_330 = (code *)0x11aa28;
  pfVar14 = local_320;
  fVar2 = fdb_commit((fdb_file_handle *)local_320,'\x01');
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_330 = (code *)0x11aa3a;
    fdb_close((fdb_file_handle *)local_320);
    lVar9 = 0;
    do {
      pcStack_330 = (code *)0x11aa49;
      fdb_doc_free(*(fdb_doc **)((long)&stack0xfffffffffffffe38 + lVar9 * 8));
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x14);
    pcStack_330 = (code *)0x11aa57;
    fdb_shutdown();
    pcVar13 = "single kv mode:";
    if ((char)local_314 != '\0') {
      pcVar13 = "multiple kv mode:";
    }
    pcStack_330 = (code *)0x11aa87;
    sprintf(local_238 + 0x20,"rollback to zero after compact test %s",pcVar13);
    pcVar13 = "%s PASSED\n";
    if (rollback_to_zero_after_compact_test(bool)::__test_pass != '\0') {
      pcVar13 = "%s FAILED\n";
    }
    pcStack_330 = (code *)0x11aab4;
    fprintf(_stderr,pcVar13,local_238 + 0x20);
    return;
  }
  goto LAB_0011aae9;
LAB_0011b7d0:
  pfStack_16c0 = (fdb_kvs_handle *)0x11b7d5;
  rollback_all_test();
LAB_0011b7d5:
  pfStack_16c0 = (fdb_kvs_handle *)0x11b7da;
  rollback_all_test();
LAB_0011b7da:
  pfStack_16c0 = (fdb_kvs_handle *)0x11b7e2;
  rollback_all_test();
  pfVar23 = (fdb_kvs_handle *)pcVar8;
LAB_0011b7e2:
  pfStack_16c0 = (fdb_kvs_handle *)0x11b7e7;
  rollback_all_test();
LAB_0011b7e7:
  pfStack_16c0 = (fdb_kvs_handle *)0x11b7ec;
  rollback_all_test();
LAB_0011b7ec:
  pfStack_16c0 = (fdb_kvs_handle *)0x11b7f1;
  rollback_all_test();
LAB_0011b7f1:
  pfStack_16c0 = (fdb_kvs_handle *)0x11b7f6;
  rollback_all_test();
  goto LAB_0011b7f6;
LAB_0011bfab:
  pfStack_1b68 = (fdb_kvs_handle *)0x11bfb0;
  rollback_during_ops_test();
LAB_0011bfb0:
  pfStack_1b68 = (fdb_kvs_handle *)0x11bfb5;
  rollback_during_ops_test();
  goto LAB_0011bfb5;
LAB_0011c3a8:
  pfStack_1d20 = (fdb_kvs_handle *)0x11c3ad;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c3ad;
LAB_0011c7bd:
  pcStack_41d8 = (code *)0x11c7c2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c2:
  pcStack_41d8 = (code *)0x11c7c7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c7:
  pcStack_41d8 = (code *)0x11c7cc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7cc:
  pcStack_41d8 = (code *)0x11c7d1;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d1:
  pcStack_41d8 = (code *)0x11c7d6;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d6:
  pcStack_41d8 = (code *)0x11c7db;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7db:
  pcStack_41d8 = (code *)0x11c7e0;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c7e0;
LAB_0011cd0f:
  pcStack_46e0 = (code *)0x11cd14;
  rollback_without_seqtree();
  goto LAB_0011cd14;
LAB_0011d0a5:
  pfStack_48b8 = (fdb_kvs_handle *)0x11d0aa;
  tx_crash_recover_test();
LAB_0011d0aa:
  pfStack_48b8 = (fdb_kvs_handle *)0x11d0af;
  tx_crash_recover_test();
  goto LAB_0011d0af;
LAB_0011aacb:
  pcStack_330 = (code *)0x11aad0;
  rollback_to_zero_after_compact_test();
LAB_0011aad0:
  pcStack_330 = (code *)0x11aad5;
  rollback_to_zero_after_compact_test();
LAB_0011aad5:
  pcStack_330 = (code *)0x11aada;
  rollback_to_zero_after_compact_test();
LAB_0011aada:
  pcStack_330 = (code *)0x11aadf;
  rollback_to_zero_after_compact_test();
LAB_0011aadf:
  pcStack_330 = (code *)0x11aae4;
  rollback_to_zero_after_compact_test();
LAB_0011aae4:
  pcStack_330 = (code *)0x11aae9;
  rollback_to_zero_after_compact_test();
LAB_0011aae9:
  pcStack_330 = rollback_to_wal_test;
  rollback_to_zero_after_compact_test();
  __s = (char *)((ulong)pfVar14 & 0xffffffff);
  pcStack_1138 = (code *)0x11ab0d;
  pfStack_358 = (fdb_kvs_handle *)pcVar8;
  pfStack_350 = unaff_R12;
  pfStack_348 = unaff_R13;
  pcStack_340 = pcVar21;
  ppbStack_338 = __s_01;
  pcStack_330 = (code *)pcVar13;
  gettimeofday((timeval *)(auStack_1120 + 0x38),(__timezone_ptr_t)0x0);
  pcStack_1138 = (code *)0x11ab12;
  memleak_start();
  pcStack_1138 = (code *)0x11ab1e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_1138 = (code *)0x11ab2e;
  fdb_get_default_config();
  config = &fStack_10d8;
  pcStack_1138 = (code *)0x11ab3b;
  fdb_get_default_kvs_config();
  fStack_db8.buffercache_size = 0;
  fStack_db8.wal_threshold = 0x100;
  fStack_db8.flags = 1;
  fStack_db8.compaction_threshold = '\0';
  auStack_1120._28_4_ = SUB84(pfVar14,0);
  fStack_db8.multi_kv_instances = SUB81(__s,0);
  doc_01 = (fdb_doc **)(auStack_1120 + 8);
  pcStack_1138 = (code *)0x11ab75;
  fdb_open((fdb_file_handle **)doc_01,"./mvcc_test8",&fStack_db8);
  ptr_handle = (fdb_doc *)auStack_1120;
  pcStack_1138 = (code *)0x11ab88;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1120._8_8_,(fdb_kvs_handle **)ptr_handle,config);
  pcStack_1138 = (code *)0x11ab9e;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1120._0_8_,logCallbackFunc,"rollback_to_wal_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    lVar9 = 0;
    uVar20 = 0;
    do {
      pcStack_1138 = (code *)0x11abc8;
      sprintf(acStack_fc0,"key%d",uVar20 & 0xffffffff);
      pcStack_1138 = (code *)0x11abe1;
      sprintf(acStack_ec0,"meta%d",uVar20 & 0xffffffff);
      pcStack_1138 = (code *)0x11abf7;
      sprintf((char *)afStack_10c0,"body%d",uVar20 & 0xffffffff);
      pcStack_1138 = (code *)0x11ac0a;
      sVar5 = strlen(acStack_fc0);
      pcStack_1138 = (code *)0x11ac1d;
      sVar6 = strlen(acStack_ec0);
      pcStack_1138 = (code *)0x11ac2a;
      sVar7 = strlen((char *)afStack_10c0);
      pcStack_1138 = (code *)0x11ac4c;
      fdb_doc_create((fdb_doc **)((long)&pfStack_cc0 + lVar9),acStack_fc0,sVar5,acStack_ec0,sVar6,
                     afStack_10c0,sVar7);
      pcStack_1138 = (code *)0x11ac5e;
      fdb_set((fdb_kvs_handle *)auStack_1120._0_8_,(&pfStack_cc0)[uVar20]);
      uVar20 = uVar20 + 1;
      lVar9 = lVar9 + 8;
    } while (uVar20 != 300);
    pcStack_1138 = (code *)0x11ac7e;
    fdb_commit((fdb_file_handle *)auStack_1120._8_8_,'\0');
    lVar9 = 0;
    uVar20 = 0;
    do {
      auStack_1120._40_8_ = (fdb_doc **)((long)&pfStack_cc0 + lVar9);
      pcStack_1138 = (code *)0x11aca0;
      fdb_doc_free((&pfStack_cc0)[uVar20]);
      pcStack_1138 = (code *)0x11acbc;
      sprintf(acStack_fc0,"key%d",uVar20 & 0xffffffff);
      pcStack_1138 = (code *)0x11acd8;
      sprintf(acStack_ec0,"META%d",uVar20 & 0xffffffff);
      pcStack_1138 = (code *)0x11acf1;
      sprintf((char *)afStack_10c0,"BODY%d",uVar20 & 0xffffffff);
      pcStack_1138 = (code *)0x11acf9;
      sVar5 = strlen(acStack_fc0);
      pcStack_1138 = (code *)0x11ad04;
      sVar6 = strlen(acStack_ec0);
      pcStack_1138 = (code *)0x11ad0f;
      sVar7 = strlen((char *)afStack_10c0);
      pcStack_1138 = (code *)0x11ad31;
      fdb_doc_create((fdb_doc **)auStack_1120._40_8_,acStack_fc0,sVar5,acStack_ec0,sVar6,
                     afStack_10c0,sVar7);
      pcStack_1138 = (code *)0x11ad43;
      fdb_set((fdb_kvs_handle *)auStack_1120._0_8_,(&pfStack_cc0)[uVar20]);
      uVar20 = uVar20 + 1;
      lVar9 = lVar9 + 8;
    } while (uVar20 != 0x96);
    pcStack_1138 = (code *)0x11ad63;
    fdb_commit((fdb_file_handle *)auStack_1120._8_8_,'\0');
    uVar20 = 0x96;
    doc_01 = apfStack_810;
    do {
      pcStack_1138 = (code *)0x11ad79;
      fdb_doc_free(*doc_01);
      pcStack_1138 = (code *)0x11ad95;
      sprintf(acStack_fc0,"key%d",uVar20 & 0xffffffff);
      __s = acStack_ec0;
      pcStack_1138 = (code *)0x11adb1;
      sprintf(__s,"Meta%d",uVar20 & 0xffffffff);
      ptr_handle = afStack_10c0;
      pcStack_1138 = (code *)0x11adca;
      sprintf((char *)ptr_handle,"Body%d",uVar20 & 0xffffffff);
      pcStack_1138 = (code *)0x11add2;
      unaff_R12 = (fdb_kvs_handle *)strlen(acStack_fc0);
      pcStack_1138 = (code *)0x11addd;
      unaff_R13 = (fdb_kvs_handle *)strlen(__s);
      pcStack_1138 = (code *)0x11ade8;
      sVar5 = strlen((char *)ptr_handle);
      pcStack_1138 = (code *)0x11ae08;
      fdb_doc_create(doc_01,acStack_fc0,(size_t)unaff_R12,__s,(size_t)unaff_R13,ptr_handle,sVar5);
      pcStack_1138 = (code *)0x11ae15;
      fdb_set((fdb_kvs_handle *)auStack_1120._0_8_,*doc_01);
      uVar20 = uVar20 + 1;
      doc_01 = doc_01 + 1;
    } while (uVar20 != 300);
    pcStack_1138 = (code *)0x11ae35;
    fdb_commit((fdb_file_handle *)auStack_1120._8_8_,'\0');
    pcStack_1138 = (code *)0x11ae44;
    fVar2 = fdb_rollback((fdb_kvs_handle **)auStack_1120,0x1c2);
    config = (fdb_kvs_config *)0x12c;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afa5;
    pcStack_1138 = (code *)0x11ae75;
    fdb_doc_create((fdb_doc **)(auStack_1120 + 0x10),(void *)psStack_cb8[4],*psStack_cb8,(void *)0x0
                   ,0,(void *)0x0,0);
    pcStack_1138 = (code *)0x11ae89;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1120._0_8_,
                              (fdb_kvs_handle **)(auStack_1120 + 0x20),0x1c2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afaa;
    pcStack_1138 = (code *)0x11aea0;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_1120._32_8_,(fdb_doc *)auStack_1120._16_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afaf;
    config = *(fdb_kvs_config **)(auStack_1120._16_8_ + 0x40);
    doc_01 = (fdb_doc **)psStack_cb8[8];
    pcStack_1138 = (code *)0x11aecc;
    iVar3 = bcmp(config,doc_01,*(size_t *)(auStack_1120._16_8_ + 0x10));
    ptr_handle = (fdb_doc *)auStack_1120._16_8_;
    if (iVar3 == 0) {
      if (*(fdb_seqnum_t *)(auStack_1120._16_8_ + 0x28) != 0x12e) {
        pcStack_1138 = (code *)0x11aef0;
        rollback_to_wal_test();
        auStack_1120._16_8_ = auStack_1120._48_8_;
      }
      pcStack_1138 = (code *)0x11aefb;
      fdb_doc_free((fdb_doc *)auStack_1120._16_8_);
      pcStack_1138 = (code *)0x11af05;
      fdb_kvs_close((fdb_kvs_handle *)auStack_1120._32_8_);
      pcStack_1138 = (code *)0x11af0f;
      fdb_close((fdb_file_handle *)auStack_1120._8_8_);
      lVar9 = 0;
      do {
        pcStack_1138 = (code *)0x11af1e;
        fdb_doc_free((&pfStack_cc0)[lVar9]);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 300);
      pcStack_1138 = (code *)0x11af2f;
      fdb_shutdown();
      pcStack_1138 = (code *)0x11af34;
      memleak_end();
      pcVar13 = "single kv mode:";
      if (auStack_1120[0x1c] != '\0') {
        pcVar13 = "multiple kv mode:";
      }
      pcStack_1138 = (code *)0x11af61;
      sprintf((char *)afStack_10c0,"rollback to wal test %s",pcVar13);
      pcVar13 = "%s PASSED\n";
      if (rollback_to_wal_test(bool)::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pcStack_1138 = (code *)0x11af8e;
      fprintf(_stderr,pcVar13,afStack_10c0);
      return;
    }
  }
  else {
    pcStack_1138 = (code *)0x11afa5;
    rollback_to_wal_test();
LAB_0011afa5:
    pcStack_1138 = (code *)0x11afaa;
    rollback_to_wal_test();
LAB_0011afaa:
    pcStack_1138 = (code *)0x11afaf;
    rollback_to_wal_test();
LAB_0011afaf:
    pcStack_1138 = (code *)0x11afb4;
    rollback_to_wal_test();
  }
  pcStack_1138 = rollback_all_test;
  ppfVar18 = doc_01;
  rollback_to_wal_test();
  pfStack_16c0 = (fdb_kvs_handle *)0x11afe4;
  fStack_1358.bub_ctx.space_used = (uint64_t)ptr_handle;
  fStack_1358.bub_ctx.handle = unaff_R12;
  pfStack_1150 = unaff_R13;
  pfStack_1148 = config;
  ppfStack_1140 = doc_01;
  pcStack_1138 = (code *)__s;
  gettimeofday(&tStack_1608,(__timezone_ptr_t)0x0);
  pfStack_16c0 = (fdb_kvs_handle *)0x11afe9;
  memleak_start();
  pfStack_16c0 = (fdb_kvs_handle *)0x11aff5;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_16c0 = (fdb_kvs_handle *)0x11b005;
  fdb_get_default_config();
  pfStack_16c0 = (fdb_kvs_handle *)0x11b00f;
  fdb_get_default_kvs_config();
  fStack_1358.config.encryption_key.bytes[4] = '\0';
  fStack_1358.config.encryption_key.bytes[5] = '\0';
  fStack_1358.config.encryption_key.bytes[6] = '\0';
  fStack_1358.config.encryption_key.bytes[7] = '\0';
  fStack_1358.config.encryption_key.bytes[8] = '\0';
  fStack_1358.config.encryption_key.bytes[9] = '\0';
  fStack_1358.config.encryption_key.bytes[10] = '\0';
  fStack_1358.config.encryption_key.bytes[0xb] = '\0';
  fStack_1358.config.encryption_key.bytes[0xc] = '\0';
  fStack_1358.config.encryption_key.bytes[0xd] = '\x04';
  fStack_1358.config.encryption_key.bytes[0xe] = '\0';
  fStack_1358.config.encryption_key.bytes[0xf] = '\0';
  fStack_1358.config.encryption_key.bytes[0x10] = '\0';
  fStack_1358.config.encryption_key.bytes[0x11] = '\0';
  fStack_1358.config.encryption_key.bytes[0x12] = '\0';
  fStack_1358.config.encryption_key.bytes[0x13] = '\0';
  fStack_1358.config._180_4_ = 1;
  fStack_1358.config.block_reusing_threshold._7_1_ = 0;
  fStack_1358.max_seqnum = 0;
  pfStack_16c0 = (fdb_kvs_handle *)0x11b045;
  fStack_1358.config.num_keeping_headers._0_1_ = (char)ppfVar18;
  fdb_open(&pfStack_16b0,"./mvcc_test6",(fdb_config *)&fStack_1358.config.encryption_key);
  iStack_16a4 = (int)ppfVar18;
  if (iStack_16a4 == 0) {
    pfStack_16c0 = (fdb_kvs_handle *)0x11b0b1;
    fdb_kvs_open_default
              (pfStack_16b0,(fdb_kvs_handle **)(auStack_1690 + 8),
               (fdb_kvs_config *)(auStack_1658 + 8));
    pfVar14 = (fdb_kvs_handle *)0x1;
  }
  else {
    ppfVar10 = (fdb_kvs_handle **)(auStack_1690 + 8);
    unaff_R12 = (fdb_kvs_handle *)(auStack_1658 + 8);
    uVar20 = 0;
    do {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b076;
      sprintf(auStack_1658,"kv%d",uVar20 & 0xffffffff);
      pfStack_16c0 = (fdb_kvs_handle *)0x11b089;
      fdb_kvs_open(pfStack_16b0,ppfVar10,auStack_1658,(fdb_kvs_config *)unaff_R12);
      uVar20 = uVar20 + 1;
      ppfVar10 = ppfVar10 + 1;
    } while (uVar20 != 4);
    pfVar14 = (fdb_kvs_handle *)0x4;
    unaff_R13 = (fdb_kvs_handle *)0x4;
  }
  pcVar21 = (char *)0x0;
  pcVar8 = logCallbackFunc;
  pcVar13 = "rollback_all_test";
  do {
    pfStack_16c0 = (fdb_kvs_handle *)0x11b0d7;
    fVar2 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_1690 + (long)pcVar21 * 8 + 8),logCallbackFunc,
                       "rollback_all_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b7d0;
      rollback_all_test();
      goto LAB_0011b7d0;
    }
    pcVar21 = (char *)((long)&((fdb_txn *)pcVar21)->handle + 1);
  } while (pfVar14 != (fdb_kvs_handle *)pcVar21);
  uVar20 = 0;
  do {
    pfStack_16c0 = (fdb_kvs_handle *)0x11b106;
    sprintf(acStack_1458,"key%d",uVar20 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b122;
    sprintf(acStack_1558,"meta%d",uVar20 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b13e;
    sprintf((char *)&fStack_1358,"body%d",uVar20 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b151;
    sVar5 = strlen(acStack_1458);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b15c;
    sVar6 = strlen(acStack_1558);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b167;
    sVar7 = strlen((char *)&fStack_1358);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b18c;
    fdb_doc_create((fdb_doc **)(auStack_15f8 + uVar20 * 8),acStack_1458,sVar5,acStack_1558,sVar6,
                   &fStack_1358,sVar7);
    lVar9 = 0;
    do {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b19c;
      fdb_set(*(fdb_kvs_handle **)(auStack_1690 + lVar9 * 8 + 8),
              *(fdb_doc **)(auStack_15f8 + uVar20 * 8));
      lVar9 = lVar9 + 1;
    } while (pfVar14 != (fdb_kvs_handle *)lVar9);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 5);
  pfStack_16c0 = (fdb_kvs_handle *)0x11b1c0;
  fdb_commit(pfStack_16b0,'\x01');
  uVar20 = 5;
  do {
    pfStack_16c0 = (fdb_kvs_handle *)0x11b1e2;
    sprintf(acStack_1458,"key%d",uVar20 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b1fe;
    sprintf(acStack_1558,"meta%d",uVar20 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b21a;
    sprintf((char *)&fStack_1358,"body%d",uVar20 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b22d;
    sVar5 = strlen(acStack_1458);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b238;
    sVar6 = strlen(acStack_1558);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b243;
    sVar7 = strlen((char *)&fStack_1358);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b268;
    fdb_doc_create((fdb_doc **)(auStack_15f8 + uVar20 * 8),acStack_1458,sVar5,acStack_1558,sVar6,
                   &fStack_1358,sVar7);
    lVar9 = 0;
    do {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b279;
      fdb_set(*(fdb_kvs_handle **)(auStack_1690 + lVar9 * 8 + 8),
              *(fdb_doc **)(auStack_15f8 + uVar20 * 8));
      lVar9 = lVar9 + 1;
    } while (pfVar14 != (fdb_kvs_handle *)lVar9);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 10);
  pfStack_16c0 = (fdb_kvs_handle *)0x11b29a;
  fdb_commit(pfStack_16b0,'\0');
  uVar20 = 10;
  do {
    pfStack_16c0 = (fdb_kvs_handle *)0x11b2bc;
    sprintf(acStack_1458,"key%d",uVar20 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b2d8;
    sprintf(acStack_1558,"meta%d",uVar20 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b2f4;
    sprintf((char *)&fStack_1358,"body%d",uVar20 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b307;
    sVar5 = strlen(acStack_1458);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b312;
    sVar6 = strlen(acStack_1558);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b31d;
    sVar7 = strlen((char *)&fStack_1358);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b342;
    fdb_doc_create((fdb_doc **)(auStack_15f8 + uVar20 * 8),acStack_1458,sVar5,acStack_1558,sVar6,
                   &fStack_1358,sVar7);
    lVar9 = 0;
    do {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b353;
      fdb_set(*(fdb_kvs_handle **)(auStack_1690 + lVar9 * 8 + 8),
              *(fdb_doc **)(auStack_15f8 + uVar20 * 8));
      lVar9 = lVar9 + 1;
    } while (pfVar14 != (fdb_kvs_handle *)lVar9);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 0xf);
  pfStack_16c0 = (fdb_kvs_handle *)0x11b377;
  fdb_commit(pfStack_16b0,'\x01');
  uVar20 = 0xf;
  do {
    pfStack_16c0 = (fdb_kvs_handle *)0x11b399;
    sprintf(acStack_1458,"key%d",uVar20 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b3b5;
    sprintf(acStack_1558,"meta%d",uVar20 & 0xffffffff);
    pfVar23 = &fStack_1358;
    pfStack_16c0 = (fdb_kvs_handle *)0x11b3d1;
    sprintf((char *)pfVar23,"body%d",uVar20 & 0xffffffff);
    unaff_R12 = (fdb_kvs_handle *)(auStack_15f8 + uVar20 * 8);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b3e4;
    sVar5 = strlen(acStack_1458);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b3ef;
    unaff_R13 = (fdb_kvs_handle *)strlen(acStack_1558);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b3fa;
    sVar6 = strlen((char *)pfVar23);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b41f;
    fdb_doc_create((fdb_doc **)unaff_R12,acStack_1458,sVar5,acStack_1558,(size_t)unaff_R13,pfVar23,
                   sVar6);
    pcVar21 = (char *)0x0;
    do {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b430;
      fdb_set(*(fdb_kvs_handle **)(auStack_1690 + (long)pcVar21 * 8 + 8),
              *(fdb_doc **)&unaff_R12->kvs_config);
      pcVar21 = (char *)((long)pcVar21 + 1);
    } while (pfVar14 != (fdb_kvs_handle *)pcVar21);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 0x14);
  pfStack_16c0 = (fdb_kvs_handle *)0x11b451;
  fdb_commit(pfStack_16b0,'\0');
  pfStack_16c0 = (fdb_kvs_handle *)0x11b465;
  fVar2 = fdb_get_all_snap_markers
                    (pfStack_16b0,(fdb_snapshot_info_t **)&pfStack_1698,(uint64_t *)&pfStack_16a0);
  pcVar13 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    if ((char)iStack_16a4 == '\0') {
      if (pfStack_16a0 != (fdb_kvs_handle *)0x4) {
        pfStack_16c0 = (fdb_kvs_handle *)0x11b49b;
        rollback_all_test();
      }
    }
    else if (pfStack_16a0 != (fdb_kvs_handle *)0x8) {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b489;
      rollback_all_test();
    }
    pfStack_16c0 = (fdb_kvs_handle *)0x11b4ae;
    fVar2 = fdb_rollback_all(pfStack_16b0,(fdb_snapshot_marker_t)pfStack_1698->kvs);
    if ((char)iStack_16a4 == '\0') {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7fb;
LAB_0011b5f4:
      unaff_R12 = (fdb_kvs_handle *)0x0;
      unaff_R13 = (fdb_kvs_handle *)auStack_1690;
      pcVar13 = (char *)&_Stack_1660;
      do {
        pfStack_16c0 = (fdb_kvs_handle *)0x11b613;
        fVar2 = fdb_get_kvs_info(*(fdb_kvs_handle **)(auStack_1690 + (long)unaff_R12 * 8 + 8),
                                 &fStack_1638);
        pcVar8 = (code *)pfVar23;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7d5;
        if ((hbtrie *)fStack_1638.last_seqnum != (hbtrie *)0xf) {
          pfStack_16c0 = (fdb_kvs_handle *)0x11b6c7;
          rollback_all_test();
        }
        if ((filemgr_ops *)fStack_1638.doc_count != (filemgr_ops *)0xf) {
          pfStack_16c0 = (fdb_kvs_handle *)0x11b6d9;
          rollback_all_test();
        }
        pfStack_16c0 = (fdb_kvs_handle *)0x11b64b;
        fVar2 = fdb_get(*(fdb_kvs_handle **)(auStack_1690 + (long)unaff_R12 * 8 + 8),
                        (fdb_doc *)auStack_15f8._152_8_);
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011b7d0;
        pfStack_16c0 = (fdb_kvs_handle *)0x11b673;
        fVar2 = fdb_get_kv(*(fdb_kvs_handle **)(auStack_1690 + (long)unaff_R12 * 8 + 8),
                           *(_func_cs_off_t_int **)(auStack_15f8._0_8_ + 0x20),
                           (size_t)*(_func_int_char_ptr_int_mode_t **)auStack_15f8._0_8_,
                           (void **)unaff_R13,(size_t *)pcVar13);
        pcVar8 = (code *)auStack_1690._0_8_;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7e2;
        pcVar21 = *(char **)(auStack_15f8._0_8_ + 0x40);
        pfStack_16c0 = (fdb_kvs_handle *)0x11b69c;
        iVar3 = bcmp(pcVar21,(void *)auStack_1690._0_8_,_Stack_1660._M_i);
        if (iVar3 != 0) goto LAB_0011b7da;
        pfStack_16c0 = (fdb_kvs_handle *)0x11b6ac;
        free(pcVar8);
        unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
        pfVar23 = (fdb_kvs_handle *)pcVar8;
      } while (pfVar14 != unaff_R12);
      pfVar23 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_16c0 = (fdb_kvs_handle *)0x11b6f2;
        fVar2 = fdb_set(*(fdb_kvs_handle **)(auStack_1690 + (long)pfVar23 * 8 + 8),
                        (fdb_doc *)auStack_15f8._0_8_);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7e7;
        pfVar23 = (fdb_kvs_handle *)&(pfVar23->kvs_config).field_0x1;
      } while (pfVar14 != pfVar23);
      pfStack_16c0 = (fdb_kvs_handle *)0x11b711;
      fVar2 = fdb_commit(pfStack_16b0,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b800;
      pfStack_16c0 = (fdb_kvs_handle *)0x11b723;
      fdb_close(pfStack_16b0);
      lVar9 = 0;
      do {
        pfStack_16c0 = (fdb_kvs_handle *)0x11b732;
        fdb_doc_free(*(fdb_doc **)(auStack_15f8 + lVar9 * 8));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x14);
      pfStack_16c0 = (fdb_kvs_handle *)0x11b74a;
      fVar2 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStack_1698,(uint64_t)pfStack_16a0);
      pfVar23 = (fdb_kvs_handle *)0x14;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pfStack_16c0 = (fdb_kvs_handle *)0x11b757;
        fdb_shutdown();
        pfStack_16c0 = (fdb_kvs_handle *)0x11b75c;
        memleak_end();
        pcVar13 = "single kv mode:";
        if ((char)iStack_16a4 != '\0') {
          pcVar13 = "multiple kv mode:";
        }
        pfStack_16c0 = (fdb_kvs_handle *)0x11b78c;
        sprintf((char *)&fStack_1358,"rollback all test %s",pcVar13);
        pcVar13 = "%s PASSED\n";
        if (rollback_all_test(bool)::__test_pass != '\0') {
          pcVar13 = "%s FAILED\n";
        }
        pfStack_16c0 = (fdb_kvs_handle *)0x11b7b9;
        fprintf(_stderr,pcVar13,&fStack_1358);
        return;
      }
      goto LAB_0011b805;
    }
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b80a;
    pfVar23 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b4ce;
      fdb_kvs_close(*(fdb_kvs_handle **)(auStack_1690 + (long)pfVar23 * 8 + 8));
      pfVar23 = (fdb_kvs_handle *)((long)pfVar23 + 1);
    } while (pfVar14 != pfVar23);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b4f2;
    fVar2 = fdb_open((fdb_file_handle **)&fStack_1638,"./mvcc_test6",
                     (fdb_config *)&fStack_1358.config.encryption_key);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b80f;
    pfStack_16c0 = (fdb_kvs_handle *)0x11b518;
    fVar2 = fdb_kvs_open((fdb_file_handle *)fStack_1638.name,(fdb_kvs_handle **)auStack_1690,"kv0",
                         (fdb_kvs_config *)(auStack_1658 + 8));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b814;
    pfStack_16c0 = (fdb_kvs_handle *)0x11b533;
    fVar2 = fdb_rollback_all(pfStack_16b0,(fdb_snapshot_marker_t)pfStack_1698->kvs);
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b819;
    pfStack_16c0 = (fdb_kvs_handle *)0x11b546;
    fVar2 = fdb_kvs_close((fdb_kvs_handle *)auStack_1690._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b81e;
    pfStack_16c0 = (fdb_kvs_handle *)0x11b55b;
    fVar2 = fdb_close((fdb_file_handle *)fStack_1638.name);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b576;
      fVar2 = fdb_rollback_all(pfStack_16b0,(fdb_snapshot_marker_t)pfStack_1698->kvs);
      unaff_R13 = (fdb_kvs_handle *)(auStack_1690 + 8);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcVar13 = auStack_1658;
        pcVar21 = "rollback_all_test";
        pfVar23 = (fdb_kvs_handle *)0x0;
        unaff_R12 = pfVar14;
        do {
          pfStack_16c0 = (fdb_kvs_handle *)0x11b5a7;
          sprintf(pcVar13,"kv%d",pfVar23);
          pfStack_16c0 = (fdb_kvs_handle *)0x11b5bc;
          fVar2 = fdb_kvs_open(pfStack_16b0,(fdb_kvs_handle **)unaff_R13,pcVar13,
                               (fdb_kvs_config *)(auStack_1658 + 8));
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7f1;
          pfStack_16c0 = (fdb_kvs_handle *)0x11b5d7;
          fVar2 = fdb_set_log_callback
                            (*(fdb_kvs_handle **)&unaff_R13->kvs_config,logCallbackFunc,
                             "rollback_all_test");
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7ec;
          pfVar23 = (fdb_kvs_handle *)(ulong)((int)pfVar23 + 1);
          unaff_R13 = (fdb_kvs_handle *)&(unaff_R13->kvs_config).custom_cmp;
          unaff_R12 = (fdb_kvs_handle *)((long)&unaff_R12[-1].bub_ctx.handle + 7);
        } while (unaff_R12 != (fdb_kvs_handle *)0x0);
        goto LAB_0011b5f4;
      }
      goto LAB_0011b7fb;
    }
  }
  else {
LAB_0011b7f6:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b7fb;
    rollback_all_test();
LAB_0011b7fb:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b800;
    rollback_all_test();
LAB_0011b800:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b805;
    rollback_all_test();
LAB_0011b805:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b80a;
    rollback_all_test();
LAB_0011b80a:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b80f;
    rollback_all_test();
LAB_0011b80f:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b814;
    rollback_all_test();
LAB_0011b814:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b819;
    rollback_all_test();
LAB_0011b819:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b81e;
    rollback_all_test();
LAB_0011b81e:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b823;
    rollback_all_test();
  }
  pfStack_16c0 = (fdb_kvs_handle *)auto_compaction_snapshots_test;
  rollback_all_test();
  pfStack_18b8 = (fdb_kvs_handle *)0x11b845;
  pfStack_16e8 = pfVar23;
  pfStack_16e0 = unaff_R12;
  pfStack_16d8 = unaff_R13;
  pfStack_16d0 = (fdb_txn *)pcVar21;
  pfStack_16c8 = (fdb_kvs_handle *)pcVar13;
  pfStack_16c0 = pfVar14;
  gettimeofday(&tStack_1840,(__timezone_ptr_t)0x0);
  pfStack_18b8 = (fdb_kvs_handle *)0x11b84a;
  memleak_start();
  pfVar22 = (filemgr_ops *)auStack_1884;
  auStack_1884._0_4_ = 0;
  pfStack_18b8 = (fdb_kvs_handle *)0x11b862;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar23 = (fdb_kvs_handle *)&stack0xffffffffffffe820;
  pfStack_18b8 = (fdb_kvs_handle *)0x11b872;
  fdb_get_default_config();
  uStack_17b2 = 1;
  uStack_17c0 = 1;
  pcStack_1788 = compaction_cb_count;
  auStack_1780[0] = ' ';
  auStack_1780[1] = '\0';
  auStack_1780[2] = '\0';
  auStack_1780[3] = '\0';
  pbStack_17a8 = (btree *)0x1;
  pfVar17 = (fdb_kvs_handle *)0x155054;
  pfStack_18b8 = (fdb_kvs_handle *)0x11b8ac;
  pfStack_1778 = pfVar22;
  fVar2 = fdb_open(&pfStack_1890,"mvcc_test1",(fdb_config *)pfVar23);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar23 = (fdb_kvs_handle *)(auStack_1884 + 4);
    pfStack_18b8 = (fdb_kvs_handle *)0x11b8c1;
    fdb_get_default_kvs_config();
    _Stack_1820 = aStack_1870.super___atomic_base<unsigned_long>._M_i;
    _Stack_1830._M_i = auStack_1884._4_8_;
    pkStack_1828 = pkStack_1878;
    pfVar17 = (fdb_kvs_handle *)&pfStack_1898;
    pfStack_18b8 = (fdb_kvs_handle *)0x11b8e6;
    fVar2 = fdb_kvs_open_default
                      (pfStack_1890,(fdb_kvs_handle **)pfVar17,(fdb_kvs_config *)&_Stack_1830);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbcd;
    unaff_R13 = (fdb_kvs_handle *)0x155958;
    unaff_R12 = (fdb_kvs_handle *)0x0;
    do {
      pcVar13 = (char *)0xcccccccd;
      pfVar15 = (fdb_kvs_handle *)0x1555bd;
      pfVar17 = (fdb_kvs_handle *)(auStack_1884 + 4);
      iVar3 = (int)unaff_R12;
      pfStack_18b8 = (fdb_kvs_handle *)0x11b91a;
      sprintf((char *)pfVar17,"%d",unaff_R12);
      pfVar14 = pfStack_1898;
      pfStack_18b8 = (fdb_kvs_handle *)0x11b927;
      sVar5 = strlen((char *)pfVar17);
      pfStack_18b8 = (fdb_kvs_handle *)0x11b93e;
      fVar2 = fdb_set_kv(pfVar14,pfVar17,sVar5,"value",5);
      pfVar16 = unaff_R13;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_18b8 = (fdb_kvs_handle *)0x11bb86;
        auto_compaction_snapshots_test();
LAB_0011bb86:
        pfStack_18b8 = (fdb_kvs_handle *)0x11bb8b;
        auto_compaction_snapshots_test();
LAB_0011bb8b:
        pfVar23 = pfVar14;
        pfStack_18b8 = (fdb_kvs_handle *)0x11bb90;
        auto_compaction_snapshots_test();
LAB_0011bb90:
        pfStack_18b8 = (fdb_kvs_handle *)0x11bb95;
        auto_compaction_snapshots_test();
LAB_0011bb95:
        pfStack_18b8 = (fdb_kvs_handle *)0x11bb9a;
        auto_compaction_snapshots_test();
        unaff_R13 = pfVar16;
        doc_02 = (fdb_kvs_handle *)pcVar13;
LAB_0011bb9a:
        pfVar16 = unaff_R13;
        unaff_R13 = pfVar15;
        pfStack_18b8 = (fdb_kvs_handle *)0x11bb9f;
        auto_compaction_snapshots_test();
LAB_0011bb9f:
        pfStack_18b8 = (fdb_kvs_handle *)0x11bbac;
        auto_compaction_snapshots_test();
LAB_0011bbac:
        pfStack_18b8 = (fdb_kvs_handle *)0x11bbb9;
        pfVar17 = pfVar23;
        auto_compaction_snapshots_test();
LAB_0011bbb9:
        pfStack_18b8 = (fdb_kvs_handle *)0x11bbbe;
        auto_compaction_snapshots_test();
        pfVar14 = unaff_R13;
        pcVar13 = (char *)doc_02;
LAB_0011bbbe:
        unaff_R13 = pfVar16;
        pfStack_18b8 = (fdb_kvs_handle *)0x11bbc3;
        auto_compaction_snapshots_test();
LAB_0011bbc3:
        pfVar22 = (filemgr_ops *)(auStack_1884 + 4);
        pfStack_18b8 = (fdb_kvs_handle *)0x11bbc8;
        auto_compaction_snapshots_test();
        goto LAB_0011bbc8;
      }
      pfVar14 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 10) * 10 == iVar3) {
        pfVar17 = (fdb_kvs_handle *)0x0;
        pfStack_18b8 = (fdb_kvs_handle *)0x11b96a;
        fVar2 = fdb_commit(pfStack_1890,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb86;
      }
      pfVar23 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 100) * 100 == iVar3) {
        pfStack_18b8 = (fdb_kvs_handle *)0x11b99b;
        fVar2 = fdb_get_kvs_info(pfStack_1898,&fStack_1810);
        pfVar23 = (fdb_kvs_handle *)fStack_1810.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb8b;
        pfStack_18b8 = (fdb_kvs_handle *)0x11b9bd;
        fVar2 = fdb_snapshot_open(pfStack_1898,&pfStack_18a0,fStack_1810.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb95;
        pfStack_18b8 = (fdb_kvs_handle *)0x11b9e3;
        fdb_doc_create((fdb_doc **)&pfStack_18a8,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        pfStack_18a8->fhandle = (fdb_file_handle *)pfVar23;
        pfStack_18b8 = (fdb_kvs_handle *)0x11b9f6;
        fVar2 = fdb_get_byseq(pfStack_18a0,(fdb_doc *)pfStack_18a8);
        pfVar16 = pfStack_18a8;
        doc_02 = (fdb_kvs_handle *)pcVar13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb9a;
        pcVar13 = (char *)pfStack_18a8->op_stats;
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba17;
        sVar5 = strlen(auStack_1884 + 4);
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba25;
        iVar4 = bcmp(pcVar13,auStack_1884 + 4,sVar5);
        doc_02 = (fdb_kvs_handle *)pcVar13;
        if (iVar4 != 0) goto LAB_0011bb9f;
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba35;
        fdb_doc_free((fdb_doc *)pfVar16);
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba3f;
        fVar2 = fdb_kvs_close(pfStack_18a0);
        pfVar15 = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb90;
        pfVar17 = (fdb_kvs_handle *)&pfStack_18a0;
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba5d;
        fVar2 = fdb_snapshot_open(pfStack_1898,(fdb_kvs_handle **)pfVar17,0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbb9;
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba83;
        fdb_doc_create((fdb_doc **)&pfStack_18a8,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        pfStack_18a8->fhandle = (fdb_file_handle *)pfVar23;
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba96;
        pfVar17 = pfStack_18a8;
        fVar2 = fdb_get_byseq(pfStack_18a0,(fdb_doc *)pfStack_18a8);
        doc_02 = pfStack_18a8;
        pfVar14 = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbbe;
        pfVar23 = (fdb_kvs_handle *)pfStack_18a8->op_stats;
        pfVar17 = (fdb_kvs_handle *)(auStack_1884 + 4);
        pfStack_18b8 = (fdb_kvs_handle *)0x11bab4;
        sVar5 = strlen((char *)pfVar17);
        pfStack_18b8 = (fdb_kvs_handle *)0x11bac2;
        iVar4 = bcmp(pfVar23,pfVar17,sVar5);
        if (iVar4 != 0) goto LAB_0011bbac;
        pfStack_18b8 = (fdb_kvs_handle *)0x11bad2;
        fdb_doc_free((fdb_doc *)doc_02);
        pfStack_18b8 = (fdb_kvs_handle *)0x11badc;
        fVar2 = fdb_kvs_close(pfStack_18a0);
        pcVar13 = (char *)0xcccccccd;
        pfVar14 = (fdb_kvs_handle *)0x1555bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011baf4;
        goto LAB_0011bbc3;
      }
LAB_0011baf4:
      pfVar22 = (filemgr_ops *)(auStack_1884 + 4);
      pcVar13 = (char *)0xcccccccd;
      pfVar14 = (fdb_kvs_handle *)0x1555bd;
      unaff_R12 = (fdb_kvs_handle *)(ulong)(iVar3 + 1U);
    } while (iVar3 + 1U != 100000);
    pfStack_18b8 = (fdb_kvs_handle *)0x11bb0e;
    fVar2 = fdb_close(pfStack_1890);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbd2;
    pfStack_18b8 = (fdb_kvs_handle *)0x11bb1b;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_18b8 = (fdb_kvs_handle *)0x11bb28;
      memleak_end();
      pfStack_18b8 = (fdb_kvs_handle *)0x11bb42;
      sprintf(auStack_1884 + 4,"auto compaction completed %d times with snapshots",
              (ulong)(uint)auStack_1884._0_4_);
      pcVar13 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pfStack_18b8 = (fdb_kvs_handle *)0x11bb6f;
      fprintf(_stderr,pcVar13,auStack_1884 + 4);
      return;
    }
  }
  else {
LAB_0011bbc8:
    pfStack_18b8 = (fdb_kvs_handle *)0x11bbcd;
    auto_compaction_snapshots_test();
LAB_0011bbcd:
    pfStack_18b8 = (fdb_kvs_handle *)0x11bbd2;
    auto_compaction_snapshots_test();
LAB_0011bbd2:
    pfStack_18b8 = (fdb_kvs_handle *)0x11bbd7;
    auto_compaction_snapshots_test();
  }
  pfStack_18b8 = (fdb_kvs_handle *)compaction_cb_count;
  auto_compaction_snapshots_test();
  pfVar16 = (fdb_kvs_handle *)((ulong)pfVar17 & 0xffffffff);
  __tv = &tStack_18d0;
  pfStack_18e0 = (fdb_kvs_handle *)0x11bbf3;
  pfStack_18c0 = pfVar23;
  pfStack_18b8 = pfVar14;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if ((int)pfVar17 == 0x20) {
    if (extraout_RDX == 0) {
      *(int *)&pfStack_18a8->kvs_config = *(int *)&pfStack_18a8->kvs_config + 1;
      return;
    }
  }
  else {
    pfStack_18e0 = (fdb_kvs_handle *)0x11bc12;
    compaction_cb_count();
  }
  pfStack_18e0 = (fdb_kvs_handle *)rollback_during_ops_test;
  compaction_cb_count();
  pfStack_1b68 = (fdb_kvs_handle *)0x11bc37;
  pfStack_1900 = unaff_R12;
  pfStack_18f8 = unaff_R13;
  pfStack_18f0 = pfVar22;
  pfStack_18e8 = (fdb_kvs_handle *)pcVar13;
  pfStack_18e0 = pfVar16;
  gettimeofday((timeval *)(auStack_1b37 + 0x2f),(__timezone_ptr_t)0x0);
  pfStack_1b68 = (fdb_kvs_handle *)0x11bc3c;
  memleak_start();
  uStack_1b44 = 10000;
  if (__tv == (timeval *)0x0) {
    pfStack_1b68 = (fdb_kvs_handle *)0x11bc59;
    system("rm -rf  mvcc_test* > errorlog.txt");
    pfStack_1b68 = (fdb_kvs_handle *)0x11bc66;
    fdb_get_default_config();
    fconfig_01 = &fStack_1a00;
    pfStack_1b68 = (fdb_kvs_handle *)0x11bc7e;
    memcpy(fconfig_01,auStack_1af8,0xf8);
    fStack_1a00.block_reusing_threshold = 0;
    pfStack_1b68 = (fdb_kvs_handle *)0x11bc9d;
    fVar2 = fdb_open(&pfStack_1b50,"mvcc_test1",fconfig_01);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_1b68 = (fdb_kvs_handle *)0x11bcb2;
      fdb_get_default_kvs_config();
      auStack_1b37._39_8_ = uStack_1ae8;
      auStack_1b37._23_8_ = auStack_1af8._0_8_;
      auStack_1b37._31_8_ = auStack_1af8._8_8_;
      pfStack_1b68 = (fdb_kvs_handle *)0x11bcd4;
      fVar2 = fdb_kvs_open_default
                        (pfStack_1b50,&pfStack_1b58,(fdb_kvs_config *)(auStack_1b37 + 0x17));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
      unaff_R13 = (fdb_kvs_handle *)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
      __tv = (timeval *)0x1;
      uVar12 = 0;
      do {
        uVar11 = uVar12 + 1;
        pfVar16 = (fdb_kvs_handle *)(ulong)uVar11;
        pfStack_1b68 = (fdb_kvs_handle *)0x11bd03;
        sprintf(auStack_1b37,"%d",pfVar16);
        unaff_R12 = pfStack_1b58;
        pfStack_1b68 = (fdb_kvs_handle *)0x11bd10;
        sVar5 = strlen(auStack_1b37);
        pfStack_1b68 = (fdb_kvs_handle *)0x11bd2b;
        fVar2 = fdb_set_kv(unaff_R12,auStack_1b37,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pfStack_1b68 = (fdb_kvs_handle *)0x11bfab;
          rollback_during_ops_test();
          goto LAB_0011bfab;
        }
        if ((int)((ulong)__tv / 10) * 10 - 1U == uVar12) {
          unaff_R13 = (fdb_kvs_handle *)((ulong)unaff_R13 ^ 1);
          pfStack_1b68 = (fdb_kvs_handle *)0x11bd66;
          fdb_commit(pfStack_1b50,(fdb_commit_opt_t)unaff_R13);
        }
        __tv = (timeval *)(ulong)((int)__tv + 1);
        uVar12 = uVar11;
      } while (uVar11 < 10000);
      pfVar16 = (fdb_kvs_handle *)0x1;
      pfStack_1b68 = (fdb_kvs_handle *)0x11bd8b;
      fdb_commit(pfStack_1b50,'\x01');
      pfStack_1b68 = (fdb_kvs_handle *)0x11bd9a;
      fdb_get_kvs_info(pfStack_1b58,(fdb_kvs_info *)auStack_1af8);
      __tv = (timeval *)(auStack_1af8 + 8);
      if ((fdb_config *)auStack_1af8._8_8_ != (fdb_config *)0x2710) {
        pfStack_1b68 = (fdb_kvs_handle *)0x11bdb0;
        rollback_during_ops_test();
      }
      pfStack_1b68 = (fdb_kvs_handle *)0x11bdc8;
      pthread_create(&pStack_1b40,(pthread_attr_t *)0x0,rollback_during_ops_test,&uStack_1b44);
      fconfig_01 = (fdb_config *)0x155958;
      pcVar13 = auStack_1b37;
      unaff_R12 = (fdb_kvs_handle *)0x1555bd;
      do {
        pfStack_1b68 = (fdb_kvs_handle *)0x11bdea;
        sprintf(pcVar13,"%d",pfVar16);
        unaff_R13 = pfStack_1b58;
        pfStack_1b68 = (fdb_kvs_handle *)0x11bdf7;
        sVar5 = strlen(pcVar13);
        pfStack_1b68 = (fdb_kvs_handle *)0x11be0e;
        fVar2 = fdb_set_kv(unaff_R13,pcVar13,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfab;
          pfStack_1b68 = (fdb_kvs_handle *)0x11be2a;
          fVar2 = fdb_commit(pfStack_1b50,'\x01');
          if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
          goto LAB_0011bfb0;
        }
        uVar12 = (int)pfVar16 + 1;
        pfVar16 = (fdb_kvs_handle *)(ulong)uVar12;
      } while (uVar12 != 0x2711);
      pfStack_1b68 = (fdb_kvs_handle *)0x11be50;
      pthread_join(pStack_1b40,(void **)(auStack_1b37 + 0xf));
      pfStack_1b68 = (fdb_kvs_handle *)0x11be73;
      fVar2 = fdb_set_kv(pfStack_1b58,"key1",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e4;
      pfStack_1b68 = (fdb_kvs_handle *)0x11be8a;
      fVar2 = fdb_commit(pfStack_1b50,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e9;
      pfStack_1b68 = (fdb_kvs_handle *)0x11bea4;
      fdb_get_kvs_info(pfStack_1b58,(fdb_kvs_info *)auStack_1af8);
      fconfig_01 = (fdb_config *)auStack_1af8._8_8_;
      pfStack_1b68 = (fdb_kvs_handle *)0x11becb;
      fVar2 = fdb_set_kv(pfStack_1b58,"key2",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0ee;
      pfStack_1b68 = (fdb_kvs_handle *)0x11bef6;
      fVar2 = fdb_set_kv(pfStack_1b58,"key3",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f3;
      pfStack_1b68 = (fdb_kvs_handle *)0x11bf0d;
      fVar2 = fdb_commit(pfStack_1b50,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f8;
      pfStack_1b68 = (fdb_kvs_handle *)0x11bf22;
      fVar2 = fdb_rollback(&pfStack_1b58,(fdb_seqnum_t)fconfig_01);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pfStack_1b68 = (fdb_kvs_handle *)0x11bf3c;
        fdb_get_kvs_info(pfStack_1b58,(fdb_kvs_info *)auStack_1af8);
        if ((fdb_config *)auStack_1af8._8_8_ != fconfig_01) {
          pfStack_1b68 = (fdb_kvs_handle *)0x11bf4d;
          rollback_during_ops_test();
        }
        pfStack_1b68 = (fdb_kvs_handle *)0x11bf57;
        fdb_close(pfStack_1b50);
        pfStack_1b68 = (fdb_kvs_handle *)0x11bf5c;
        fdb_shutdown();
        pfStack_1b68 = (fdb_kvs_handle *)0x11bf61;
        memleak_end();
        pcVar13 = "%s PASSED\n";
        if (rollback_during_ops_test(void*)::__test_pass != '\0') {
          pcVar13 = "%s FAILED\n";
        }
        pfStack_1b68 = (fdb_kvs_handle *)0x11bf92;
        fprintf(_stderr,pcVar13,"rollback during ops test");
        return;
      }
    }
    else {
      pfStack_1b68 = (fdb_kvs_handle *)0x11c0df;
      rollback_during_ops_test();
LAB_0011c0df:
      __tv = (timeval *)auStack_1af8;
      pfStack_1b68 = (fdb_kvs_handle *)0x11c0e4;
      rollback_during_ops_test();
LAB_0011c0e4:
      pfStack_1b68 = (fdb_kvs_handle *)0x11c0e9;
      rollback_during_ops_test();
LAB_0011c0e9:
      pfStack_1b68 = (fdb_kvs_handle *)0x11c0ee;
      rollback_during_ops_test();
LAB_0011c0ee:
      pfStack_1b68 = (fdb_kvs_handle *)0x11c0f3;
      rollback_during_ops_test();
LAB_0011c0f3:
      pfStack_1b68 = (fdb_kvs_handle *)0x11c0f8;
      rollback_during_ops_test();
LAB_0011c0f8:
      pfStack_1b68 = (fdb_kvs_handle *)0x11c0fd;
      rollback_during_ops_test();
    }
    pfStack_1b68 = (fdb_kvs_handle *)0x11c102;
    rollback_during_ops_test();
LAB_0011c102:
    pfStack_1b68 = (fdb_kvs_handle *)0x11c107;
    rollback_during_ops_test();
  }
  else {
LAB_0011bfb5:
    fconfig_01 = (fdb_config *)auStack_1af8;
    pfStack_1b68 = (fdb_kvs_handle *)0x11bfc2;
    fdb_get_default_config();
    pcVar13 = (char *)&fStack_1a00;
    pfStack_1b68 = (fdb_kvs_handle *)0x11bfda;
    memcpy(pcVar13,fconfig_01,0xf8);
    fStack_1a00.block_reusing_threshold = 0;
    pfStack_1b68 = (fdb_kvs_handle *)0x11bff9;
    fVar2 = fdb_open(&pfStack_1b50,"mvcc_test1",(fdb_config *)pcVar13);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c102;
    fconfig_01 = (fdb_config *)auStack_1af8;
    pfStack_1b68 = (fdb_kvs_handle *)0x11c00e;
    fdb_get_default_kvs_config();
    auStack_1b37._39_8_ = uStack_1ae8;
    auStack_1b37._23_8_ = auStack_1af8._0_8_;
    auStack_1b37._31_8_ = auStack_1af8._8_8_;
    pfStack_1b68 = (fdb_kvs_handle *)0x11c031;
    fVar2 = fdb_kvs_open_default(pfStack_1b50,&pfStack_1b58,(fdb_kvs_config *)(auStack_1b37 + 0x17))
    ;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      __tv = (timeval *)(long)(int)__tv->tv_sec;
      if (1 < (long)__tv) {
        unaff_R13 = (fdb_kvs_handle *)0xcccccccd;
        fconfig_01 = (fdb_config *)0x155958;
        pcVar13 = auStack_1b37;
        unaff_R12 = (fdb_kvs_handle *)0x1555bd;
        do {
          pfStack_1b68 = (fdb_kvs_handle *)0x11c06e;
          sprintf(pcVar13,"%d",(ulong)__tv & 0xffffffff);
          pfVar16 = pfStack_1b58;
          pfStack_1b68 = (fdb_kvs_handle *)0x11c07b;
          sVar5 = strlen(pcVar13);
          pfStack_1b68 = (fdb_kvs_handle *)0x11c092;
          fVar2 = fdb_set_kv(pfVar16,pcVar13,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c10c;
          if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
            pfStack_1b68 = (fdb_kvs_handle *)0x11c0b8;
            fVar2 = fdb_rollback(&pfStack_1b58,(fdb_seqnum_t)__tv);
            if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c111;
          }
          bVar1 = 2 < (long)__tv;
          __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
        } while (bVar1);
      }
      pfStack_1b68 = (fdb_kvs_handle *)0x11c0d3;
      fdb_close(pfStack_1b50);
      pfStack_1b68 = (fdb_kvs_handle *)0x11c0da;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_1b68 = (fdb_kvs_handle *)0x11c10c;
  rollback_during_ops_test();
LAB_0011c10c:
  pfStack_1b68 = (fdb_kvs_handle *)0x11c111;
  rollback_during_ops_test();
LAB_0011c111:
  pfStack_1b68 = (fdb_kvs_handle *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  pfStack_1d20 = (fdb_kvs_handle *)0x11c132;
  ptStack_1b88 = __tv;
  pfStack_1b80 = unaff_R12;
  pfStack_1b78 = unaff_R13;
  pfStack_1b70 = fconfig_01;
  pfStack_1b68 = (fdb_kvs_handle *)pcVar13;
  gettimeofday((timeval *)(auStack_1ce7 + 0xf),(__timezone_ptr_t)0x0);
  pfStack_1d20 = (fdb_kvs_handle *)0x11c137;
  memleak_start();
  pfStack_1d20 = (fdb_kvs_handle *)0x11c143;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00 = &fStack_1c80;
  pfStack_1d20 = (fdb_kvs_handle *)0x11c153;
  fdb_get_default_config();
  pfStack_1d20 = (fdb_kvs_handle *)0x11c167;
  fVar2 = fdb_open(&pfStack_1d08,"mvcc_test1",fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_00 = (fdb_config *)(auStack_1cc8 + 0x30);
    pfStack_1d20 = (fdb_kvs_handle *)0x11c17f;
    fdb_get_default_kvs_config();
    pfStack_1d20 = (fdb_kvs_handle *)0x11c191;
    fVar2 = fdb_kvs_open_default(pfStack_1d08,&pfStack_1d10,(fdb_kvs_config *)fconfig_00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b2;
    fconfig_00 = (fdb_config *)0x1;
    fconfig_01 = (fdb_config *)0x155958;
    pcVar13 = auStack_1ce7;
    unaff_R12 = (fdb_kvs_handle *)0x1555bd;
    do {
      pfStack_1d20 = (fdb_kvs_handle *)0x11c1c0;
      sprintf(pcVar13,"%d",fconfig_00);
      unaff_R13 = pfStack_1d10;
      pfStack_1d20 = (fdb_kvs_handle *)0x11c1cd;
      sVar5 = strlen(pcVar13);
      pfStack_1d20 = (fdb_kvs_handle *)0x11c1e4;
      fVar2 = fdb_set_kv(unaff_R13,pcVar13,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_1d20 = (fdb_kvs_handle *)0x11c3a8;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c3a8;
      }
      uVar12 = (int)fconfig_00 + 1;
      fconfig_00 = (fdb_config *)(ulong)uVar12;
    } while (uVar12 != 4);
    pfStack_1d20 = (fdb_kvs_handle *)0x11c1ff;
    fdb_commit(pfStack_1d08,'\0');
    pfStack_1d20 = (fdb_kvs_handle *)0x11c222;
    fVar2 = fdb_set_kv(pfStack_1d10,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b7;
    pfStack_1d20 = (fdb_kvs_handle *)0x11c24d;
    fVar2 = fdb_set_kv(pfStack_1d10,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3bc;
    pfStack_1d20 = (fdb_kvs_handle *)0x11c264;
    fVar2 = fdb_commit(pfStack_1d08,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c1;
    pfStack_1d20 = (fdb_kvs_handle *)0x11c27b;
    fVar2 = fdb_rollback(&pfStack_1d10,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c6;
    fconfig_00 = (fdb_config *)auStack_1cc8;
    pfStack_1d20 = (fdb_kvs_handle *)0x11c295;
    fdb_get_kvs_info(pfStack_1d10,(fdb_kvs_info *)fconfig_00);
    if (auStack_1cc8._8_8_ != 3) {
      pfStack_1d20 = (fdb_kvs_handle *)0x11c2a6;
      in_memory_snapshot_rollback_test();
    }
    pfStack_1d20 = (fdb_kvs_handle *)0x11c2bc;
    fVar2 = fdb_snapshot_open(pfStack_1d10,&pfStack_1cf0,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3cb;
    pfStack_1d20 = (fdb_kvs_handle *)0x11c2e4;
    fdb_iterator_init(pfStack_1cf0,&pfStack_1d00,(void *)0x0,0,(void *)0x0,0,0);
    fconfig_00 = (fdb_config *)&pfStack_1cf8;
    pfStack_1cf8 = (fdb_doc *)0x0;
    fconfig_01 = (fdb_config *)0x3;
    do {
      pfStack_1d20 = (fdb_kvs_handle *)0x11c303;
      fVar2 = fdb_iterator_get(pfStack_1d00,(fdb_doc **)fconfig_00);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3a8;
      pfStack_1d20 = (fdb_kvs_handle *)0x11c315;
      fdb_doc_free(pfStack_1cf8);
      pfStack_1cf8 = (fdb_doc *)0x0;
      pfStack_1d20 = (fdb_kvs_handle *)0x11c328;
      fVar2 = fdb_iterator_next(pfStack_1d00);
      fconfig_01 = (fdb_config *)&fconfig_01[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_01 == (fdb_config *)0x0) {
      pfStack_1d20 = (fdb_kvs_handle *)0x11c343;
      fdb_iterator_close(pfStack_1d00);
      pfStack_1d20 = (fdb_kvs_handle *)0x11c34d;
      fdb_kvs_close(pfStack_1cf0);
      pfStack_1d20 = (fdb_kvs_handle *)0x11c357;
      fdb_close(pfStack_1d08);
      pfStack_1d20 = (fdb_kvs_handle *)0x11c35c;
      fdb_shutdown();
      pfStack_1d20 = (fdb_kvs_handle *)0x11c361;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pfStack_1d20 = (fdb_kvs_handle *)0x11c392;
      fprintf(_stderr,pcVar13,"in-memory snapshot rollback test");
      return;
    }
  }
  else {
LAB_0011c3ad:
    pfStack_1d20 = (fdb_kvs_handle *)0x11c3b2;
    in_memory_snapshot_rollback_test();
LAB_0011c3b2:
    pfStack_1d20 = (fdb_kvs_handle *)0x11c3b7;
    in_memory_snapshot_rollback_test();
LAB_0011c3b7:
    pfStack_1d20 = (fdb_kvs_handle *)0x11c3bc;
    in_memory_snapshot_rollback_test();
LAB_0011c3bc:
    pfStack_1d20 = (fdb_kvs_handle *)0x11c3c1;
    in_memory_snapshot_rollback_test();
LAB_0011c3c1:
    pfStack_1d20 = (fdb_kvs_handle *)0x11c3c6;
    in_memory_snapshot_rollback_test();
LAB_0011c3c6:
    pfStack_1d20 = (fdb_kvs_handle *)0x11c3cb;
    in_memory_snapshot_rollback_test();
LAB_0011c3cb:
    pfStack_1d20 = (fdb_kvs_handle *)0x11c3d0;
    in_memory_snapshot_rollback_test();
  }
  pfStack_1d20 = (fdb_kvs_handle *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_41d8 = (code *)0x11c3f2;
  pfStack_1d48 = fconfig_00;
  pfStack_1d40 = unaff_R12;
  pfStack_1d38 = unaff_R13;
  pfStack_1d30 = fconfig_01;
  pfStack_1d28 = (fdb_kvs_handle *)pcVar13;
  pfStack_1d20 = pfVar16;
  gettimeofday(&tStack_4160,(__timezone_ptr_t)0x0);
  pcStack_41d8 = (code *)0x11c3f7;
  memleak_start();
  pcStack_41d8 = (code *)0x11c403;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_41d8 = (code *)0x11c413;
  fdb_get_default_config();
  pcStack_41d8 = (code *)0x11c41d;
  fdb_get_default_kvs_config();
  fStack_4048.wal_threshold = 0x400;
  fStack_4048.compaction_mode = 0;
  fStack_4048.durability_opt = 2;
  pfVar14 = (fdb_kvs_handle *)(apfStack_3e50 + 0x20);
  ppfVar10 = apfStack_4150;
  pcVar13 = "kvs%d";
  uVar20 = 0;
  __s_00 = (fdb_kvs_handle **)0x0;
  do {
    pcStack_41d8 = (code *)0x11c45d;
    sprintf((char *)ppfVar10,"mvcc_test%d",(ulong)__s_00 & 0xffffffff);
    pcVar21 = (char *)(apfStack_41c0 + (long)__s_00);
    pcStack_41d8 = (code *)0x11c478;
    ppfVar19 = (fdb_kvs_handle **)pcVar21;
    fVar2 = fdb_open((fdb_file_handle **)pcVar21,(char *)ppfVar10,
                     (fdb_config *)(apfStack_4150 + 0x21));
    iVar3 = (int)ppfVar19;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c7;
    ppfVar19 = (fdb_kvs_handle **)0x0;
    ppfStack_41d0 = __s_00;
    pfStack_41c8 = pfVar14;
    do {
      __s_00 = ppfVar19;
      pcStack_41d8 = (code *)0x11c49d;
      sprintf((char *)ppfVar10,"kvs%d",(ulong)(uint)((int)__s_00 + (int)uVar20));
      pfVar23 = *(fdb_kvs_handle **)pcVar21;
      pcStack_41d8 = (code *)0x11c4b0;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar23,(fdb_kvs_handle **)pfVar14,(char *)ppfVar10,
                           (fdb_kvs_config *)(apfStack_41c0 + 9));
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_41d8 = (code *)0x11c7bd;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c7bd;
      }
      pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).custom_cmp;
      ppfVar19 = (fdb_kvs_handle **)((long)__s_00 + 1);
    } while ((char *)((long)__s_00 + 1) != (char *)0x80);
    __s_00 = (fdb_kvs_handle **)((long)ppfStack_41d0 + 1);
    uVar20 = uVar20 + 0x80;
    pfVar14 = (fdb_kvs_handle *)&pfStack_41c8[1].bub_ctx.space_used;
  } while (__s_00 != (fdb_kvs_handle **)0x8);
  __s_00 = apfStack_4150 + 0x40;
  ppfVar10 = apfStack_3e50;
  pfVar14 = (fdb_kvs_handle *)0x0;
  do {
    uVar20 = 0;
    do {
      pcStack_41d8 = (code *)0x11c511;
      sprintf((char *)__s_00,"key%08d",uVar20);
      pcStack_41d8 = (code *)0x11c524;
      sprintf((char *)ppfVar10,"value%08d",uVar20);
      pcVar13 = (char *)apfStack_3e50[(long)&pfVar14->op_stats];
      pcStack_41d8 = (code *)0x11c534;
      sVar5 = strlen((char *)__s_00);
      pcVar21 = (char *)(sVar5 + 1);
      pcStack_41d8 = (code *)0x11c540;
      sVar5 = strlen((char *)ppfVar10);
      pcStack_41d8 = (code *)0x11c555;
      pfVar23 = (fdb_kvs_handle *)pcVar13;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar13,__s_00,(size_t)pcVar21,ppfVar10,sVar5 + 1);
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7bd;
      uVar12 = (int)uVar20 + 1;
      uVar20 = (ulong)uVar12;
    } while (uVar12 != 10);
    pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
  } while (pfVar14 != (fdb_kvs_handle *)0x400);
  pcVar21 = (char *)0x0;
  do {
    pfVar23 = apfStack_41c0[(long)pcVar21];
    if (((ulong)pcVar21 & 1) == 0) {
      pcStack_41d8 = (code *)0x11c583;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar23,'\0');
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7e5;
    }
    else {
      pcStack_41d8 = (code *)0x11c596;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar23,'\x01');
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ea;
    }
    pcVar21 = (char *)((long)pcVar21 + 1);
  } while (pcVar21 != (char *)0x8);
  pcVar21 = "key%08d";
  __s_00 = apfStack_4150 + 0x40;
  ppfVar10 = (fdb_kvs_handle **)0x0;
  do {
    uVar20 = 0;
    do {
      pcStack_41d8 = (code *)0x11c5ca;
      sprintf((char *)__s_00,"key%08d",uVar20);
      pfVar14 = apfStack_3e50[(long)(ppfVar10 + 4)];
      pcStack_41d8 = (code *)0x11c5da;
      sVar5 = strlen((char *)__s_00);
      pcStack_41d8 = (code *)0x11c5e9;
      pfVar23 = pfVar14;
      fVar2 = fdb_del_kv(pfVar14,__s_00,sVar5 + 1);
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c2;
      uVar12 = (int)uVar20 + 1;
      uVar20 = (ulong)uVar12;
    } while (uVar12 != 10);
    ppfVar10 = (fdb_kvs_handle **)((long)ppfVar10 + 1);
  } while (ppfVar10 != (fdb_kvs_handle **)0x400);
  pcVar21 = (char *)0x0;
  do {
    pfVar23 = apfStack_41c0[(long)pcVar21];
    if (((ulong)pcVar21 & 1) == 0) {
      pcStack_41d8 = (code *)0x11c617;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar23,'\0');
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ef;
    }
    else {
      pcStack_41d8 = (code *)0x11c62a;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar23,'\x01');
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f4;
    }
    pcVar21 = (char *)((long)pcVar21 + 1);
  } while (pcVar21 != (char *)0x8);
  __s_00 = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar21 = (char *)(apfStack_3e50 + 0x20);
  do {
    pcStack_41d8 = (code *)0x11c657;
    ppfVar19 = (fdb_kvs_handle **)pcVar21;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar21,10);
    iVar3 = (int)ppfVar19;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7cc;
    __s_00 = __s_00 + 8;
    pcVar21 = (char *)((long)pcVar21 + 0x200);
  } while (__s_00 < (fdb_kvs_handle **)0x3c0);
  ppfVar10 = apfStack_41c0;
  pcVar21 = "kvs%d";
  __s_00 = apfStack_4150;
  pfVar14 = (fdb_kvs_handle *)0x0;
  do {
    pfVar23 = apfStack_3e50[(long)&pfVar14->op_stats];
    pcStack_41d8 = (code *)0x11c697;
    fVar2 = fdb_kvs_close(pfVar23);
    iVar3 = (int)pfVar23;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d6;
    pcStack_41d8 = (code *)0x11c6af;
    sprintf((char *)__s_00,"kvs%d",(ulong)pfVar14 & 0xffffffff);
    pfVar23 = *ppfVar10;
    pcStack_41d8 = (code *)0x11c6bb;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar23,(char *)__s_00);
    iVar3 = (int)pfVar23;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d1;
    pfVar14 = (fdb_kvs_handle *)&(pfVar14->config).wal_threshold;
    ppfVar10 = ppfVar10 + 1;
  } while (pfVar14 != (fdb_kvs_handle *)0x400);
  pcVar21 = (char *)0x0;
  do {
    pfVar23 = apfStack_41c0[(long)pcVar21];
    if (((ulong)pcVar21 & 1) == 0) {
      pcStack_41d8 = (code *)0x11c6e7;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar23,'\0');
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f9;
    }
    else {
      pcStack_41d8 = (code *)0x11c6fa;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar23,'\x01');
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7fe;
    }
    pcVar21 = (char *)((long)pcVar21 + 1);
  } while (pcVar21 != (char *)0x8);
  pcVar21 = "mvcc_test_compact%d";
  __s_00 = apfStack_4150;
  pfVar14 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_41d8 = (code *)0x11c72d;
    sprintf((char *)__s_00,"mvcc_test_compact%d",(ulong)pfVar14 & 0xffffffff);
    pfVar23 = apfStack_41c0[(long)pfVar14];
    pcStack_41d8 = (code *)0x11c73a;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar23,(char *)__s_00);
    iVar3 = (int)pfVar23;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7db;
    pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
  } while (pfVar14 != (fdb_kvs_handle *)0x8);
  pcVar21 = (char *)0x0;
  pcStack_41d8 = (code *)0x11c754;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar23 = apfStack_41c0[(long)pcVar21];
    pcStack_41d8 = (code *)0x11c75e;
    fVar2 = fdb_close((fdb_file_handle *)pfVar23);
    iVar3 = (int)pfVar23;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar21 = (char *)((long)pcVar21 + 1);
    if (pcVar21 == (char *)0x8) {
      pcStack_41d8 = (code *)0x11c770;
      fdb_shutdown();
      pcStack_41d8 = (code *)0x11c775;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pcStack_41d8 = (code *)0x11c7a6;
      fprintf(_stderr,pcVar13,"open multi files kvs test");
      return;
    }
  }
LAB_0011c7e0:
  pcStack_41d8 = (code *)0x11c7e5;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7e5:
  pcStack_41d8 = (code *)0x11c7ea;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ea:
  pcStack_41d8 = (code *)0x11c7ef;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ef:
  pcStack_41d8 = (code *)0x11c7f4;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f4:
  pcStack_41d8 = (code *)0x11c7f9;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f9:
  pcStack_41d8 = (code *)0x11c7fe;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7fe:
  pcStack_41d8 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_46e0 = (code *)0x11c825;
  ppfStack_4200 = (fdb_kvs_handle **)pcVar21;
  ppfStack_41f8 = ppfVar10;
  pfStack_41f0 = (fdb_kvs_handle *)pcVar13;
  ppfStack_41e8 = __s_00;
  pfStack_41e0 = pfVar14;
  pcStack_41d8 = (code *)uVar20;
  gettimeofday(&tStack_4658,(__timezone_ptr_t)0x0);
  pcStack_46e0 = (code *)0x11c82a;
  memleak_start();
  pcStack_46e0 = (code *)0x11c83a;
  fdb_get_default_config();
  pcStack_46e0 = (code *)0x11c844;
  fdb_get_default_kvs_config();
  fStack_42f8.flags = 1;
  fStack_42f8.block_reusing_threshold = 0;
  fStack_42f8.seqtree_opt = 0;
  pcStack_46e0 = (code *)0x11c86a;
  fStack_42f8.multi_kv_instances = (bool)(char)iVar3;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_46e0 = (code *)0x11c87e;
  fdb_open((fdb_file_handle **)&pfStack_46c8,"./mvcc_test1",(fdb_config *)(acStack_43f8 + 0x100));
  iStack_46a4 = iVar3;
  if (iVar3 == 0) {
    pcStack_46e0 = (code *)0x11c8ea;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_46c8,apfStack_4698,&fStack_4678);
    pcVar13 = (char *)0x1;
  }
  else {
    ppfVar10 = apfStack_4698;
    uVar20 = 0;
    do {
      pcStack_46e0 = (code *)0x11c8af;
      sprintf(acStack_4660,"kv%d",uVar20 & 0xffffffff);
      pcStack_46e0 = (code *)0x11c8c2;
      fdb_kvs_open((fdb_file_handle *)pfStack_46c8,ppfVar10,acStack_4660,&fStack_4678);
      uVar20 = uVar20 + 1;
      ppfVar10 = ppfVar10 + 1;
    } while (uVar20 != 3);
    pcVar13 = (char *)0x3;
  }
  uStack_46cc = 0;
  do {
    uVar20 = 0;
    do {
      pcStack_46e0 = (code *)0x11c916;
      sprintf(acStack_44f8,"key%d",uVar20 & 0xffffffff);
      pcStack_46e0 = (code *)0x11c937;
      sprintf(acStack_4648,"meta-%d-%d",(ulong)uStack_46cc,uVar20 & 0xffffffff);
      pcStack_46e0 = (code *)0x11c956;
      sprintf(acStack_43f8,"body-%d-%d",(ulong)uStack_46cc,uVar20 & 0xffffffff);
      doc_00 = (btree *)(&bStack_4548.ksize + uVar20 * 8);
      pcStack_46e0 = (code *)0x11c969;
      sVar5 = strlen(acStack_44f8);
      pcStack_46e0 = (code *)0x11c979;
      metalen._M_i = strlen(acStack_4648);
      pcStack_46e0 = (code *)0x11c984;
      sVar6 = strlen(acStack_43f8);
      pcStack_46e0 = (code *)0x11c9a9;
      fdb_doc_create((fdb_doc **)doc_00,acStack_44f8,sVar5,acStack_4648,metalen._M_i,acStack_43f8,
                     sVar6);
      pfVar14 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_46e0 = (code *)0x11c9ba;
        fdb_set(apfStack_4698[(long)pfVar14],*(fdb_doc **)doc_00);
        pfVar14 = (fdb_kvs_handle *)((long)pfVar14 + 1);
      } while ((fdb_kvs_handle *)pcVar13 != pfVar14);
      pcStack_46e0 = (code *)0x11c9cf;
      fdb_doc_free(*(fdb_doc **)(&bStack_4548.ksize + uVar20 * 8));
      uVar20 = uVar20 + 1;
    } while (uVar20 != 10);
    pcStack_46e0 = (code *)0x11c9f3;
    fdb_commit((fdb_file_handle *)pfStack_46c8,~(byte)uStack_46cc & 1);
    uStack_46cc = uStack_46cc + 1;
    pcVar21 = (char *)(ulong)uStack_46cc;
  } while (uStack_46cc != 5);
  pcStack_46e0 = (code *)0x11ca16;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_46c8,&pfStack_46b0,&uStack_4680);
  pfVar23 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_46e0 = (code *)0x11ca35;
    fVar2 = fdb_rollback(apfStack_4698,(pfStack_46b0[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd19;
    pfStack_46c0 = (fdb_kvs_handle *)0x0;
    pcVar21 = acStack_43f8;
    pfVar23 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_46e0 = (code *)0x11ca6a;
      fVar2 = fdb_snapshot_open(apfStack_4698[(long)pfVar23],&pfStack_46a0,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccfb:
        pcStack_46e0 = (code *)0x11cd00;
        rollback_without_seqtree();
LAB_0011cd00:
        pcStack_46e0 = (code *)0x11cd05;
        rollback_without_seqtree();
LAB_0011cd05:
        pcStack_46e0 = (code *)0x11cd0a;
        rollback_without_seqtree();
LAB_0011cd0a:
        pcStack_46e0 = (code *)0x11cd0f;
        rollback_without_seqtree();
        goto LAB_0011cd0f;
      }
      pcStack_46e0 = (code *)0x11ca92;
      fVar2 = fdb_iterator_init(pfStack_46a0,&pfStack_46b8,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccf6:
        pcStack_46e0 = (code *)0x11ccfb;
        rollback_without_seqtree();
        goto LAB_0011ccfb;
      }
      metalen._M_i = 0;
      do {
        pcStack_46e0 = (code *)0x11caac;
        fVar2 = fdb_iterator_get(pfStack_46b8,(fdb_doc **)&pfStack_46c0);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccd1:
          pcStack_46e0 = (code *)0x11ccd6;
          rollback_without_seqtree();
LAB_0011ccd6:
          pcStack_46e0 = (code *)0x11cce6;
          rollback_without_seqtree();
LAB_0011cce6:
          pcStack_46e0 = (code *)0x11ccf6;
          rollback_without_seqtree();
          goto LAB_0011ccf6;
        }
        pcStack_46e0 = (code *)0x11cacd;
        sprintf(acStack_44f8,"key%d",metalen._M_i);
        if (pfVar23 == (fdb_kvs_handle *)0x0) {
          pcStack_46e0 = (code *)0x11cb1c;
          sprintf(acStack_4648,"meta-1-%d",metalen._M_i);
          pcStack_46e0 = (code *)0x11cb30;
          sprintf(pcVar21,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_46e0 = (code *)0x11caf0;
          sprintf(acStack_4648,"meta-%d-%d",4,metalen._M_i);
          pcStack_46e0 = (code *)0x11cb09;
          sprintf(pcVar21,"body-%d-%d",4);
        }
        pfVar14 = pfStack_46c0;
        doc_00 = (btree *)pfStack_46c0->op_stats;
        pcStack_46e0 = (code *)0x11cb4c;
        iVar3 = bcmp(doc_00,acStack_44f8,*(size_t *)&pfStack_46c0->kvs_config);
        if (iVar3 != 0) {
          pcStack_46e0 = (code *)0x11ccd1;
          rollback_without_seqtree();
          goto LAB_0011ccd1;
        }
        doc_00 = pfVar14->staletree;
        pcStack_46e0 = (code *)0x11cb6c;
        iVar3 = bcmp(doc_00,acStack_4648,(size_t)(pfVar14->kvs_config).custom_cmp);
        if (iVar3 != 0) goto LAB_0011cce6;
        doc_00 = (pfVar14->field_6).seqtree;
        pcStack_46e0 = (code *)0x11cb87;
        iVar3 = bcmp(doc_00,pcVar21,(size_t)(pfVar14->kvs_config).custom_cmp_param);
        if (iVar3 != 0) goto LAB_0011ccd6;
        pcStack_46e0 = (code *)0x11cb97;
        fdb_doc_free((fdb_doc *)pfVar14);
        pfStack_46c0 = (fdb_kvs_handle *)0x0;
        uVar12 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar12;
        pcStack_46e0 = (code *)0x11cbad;
        fVar2 = fdb_iterator_next(pfStack_46b8);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar12 != 10) goto LAB_0011cd00;
      pcStack_46e0 = (code *)0x11cbca;
      fVar2 = fdb_iterator_close(pfStack_46b8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd05;
      pcStack_46e0 = (code *)0x11cbdc;
      fVar2 = fdb_kvs_close(pfStack_46a0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0a;
      pfVar23 = (fdb_kvs_handle *)&(pfVar23->kvs_config).field_0x1;
    } while (pfVar23 != (fdb_kvs_handle *)pcVar13);
    pcVar21 = (char *)0x0;
    do {
      pcStack_46e0 = (code *)0x11cbfc;
      fVar2 = fdb_kvs_close(apfStack_4698[(long)pcVar21]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0f;
      pcVar21 = pcVar21 + 1;
    } while (pcVar13 != pcVar21);
    pcStack_46e0 = (code *)0x11cc1f;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_46c8,pfStack_46b0[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd1e;
    pcStack_46e0 = (code *)0x11cc36;
    fVar2 = fdb_free_snap_markers(pfStack_46b0,uStack_4680);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_46e0 = (code *)0x11cc48;
      fdb_close((fdb_file_handle *)pfStack_46c8);
      pcStack_46e0 = (code *)0x11cc4d;
      fdb_shutdown();
      pcStack_46e0 = (code *)0x11cc52;
      memleak_end();
      pcVar13 = "single kv mode:";
      if ((char)iStack_46a4 != '\0') {
        pcVar13 = "multiple kv mode:";
      }
      pcStack_46e0 = (code *)0x11cc82;
      sprintf(acStack_43f8,"rollback without seqtree in %s",pcVar13);
      pcVar13 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pcStack_46e0 = (code *)0x11ccaf;
      fprintf(_stderr,pcVar13,acStack_43f8);
      return;
    }
  }
  else {
LAB_0011cd14:
    pcStack_46e0 = (code *)0x11cd19;
    rollback_without_seqtree();
LAB_0011cd19:
    pcStack_46e0 = (code *)0x11cd1e;
    rollback_without_seqtree();
LAB_0011cd1e:
    pcStack_46e0 = (code *)0x11cd23;
    rollback_without_seqtree();
  }
  pcStack_46e0 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_48b8 = (fdb_kvs_handle *)0x11cd45;
  pcStack_4708 = pcVar21;
  aStack_4700.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_46f8 = doc_00;
  pfStack_46f0 = pfVar14;
  pfStack_46e8 = pfVar23;
  pcStack_46e0 = (code *)pcVar13;
  gettimeofday(&tStack_4858,(__timezone_ptr_t)0x0);
  pfStack_48b8 = (fdb_kvs_handle *)0x11cd4a;
  memleak_start();
  pfStack_48b8 = (fdb_kvs_handle *)0x11cd56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar13 = auStack_4848 + 0x48;
  pfStack_48b8 = (fdb_kvs_handle *)0x11cd66;
  fdb_get_default_config();
  pfStack_48b8 = (fdb_kvs_handle *)0x11cd78;
  fVar2 = fdb_open(&pfStack_48b0,"./mvcc_test2",(fdb_config *)pcVar13);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar13 = auStack_4848;
    pfStack_48b8 = (fdb_kvs_handle *)0x11cd8d;
    fdb_get_default_kvs_config();
    pbStack_4860 = (btreeblk_handle *)auStack_4848._16_8_;
    pfStack_4870 = (filemgr *)auStack_4848._0_8_;
    pdStack_4868 = (docio_handle *)auStack_4848._8_8_;
    pfStack_48b8 = (fdb_kvs_handle *)0x11cdae;
    fVar2 = fdb_kvs_open_default(pfStack_48b0,&pfStack_48a8,(fdb_kvs_config *)&pfStack_4870);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0b9;
    pfStack_48b8 = (fdb_kvs_handle *)0x11cdc4;
    fVar2 = fdb_begin_transaction(pfStack_48b0,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0be;
    pcVar13 = "key%d";
    pfVar14 = (fdb_kvs_handle *)acStack_489f;
    pfVar23 = (fdb_kvs_handle *)0x1555bd;
    uVar20 = 0;
    do {
      pfStack_48b8 = (fdb_kvs_handle *)0x11cdf0;
      sprintf((char *)pfVar14,"key%d",uVar20);
      pfVar17 = pfStack_48a8;
      pfStack_48b8 = (fdb_kvs_handle *)0x11cdfd;
      sVar5 = strlen((char *)pfVar14);
      pfStack_48b8 = (fdb_kvs_handle *)0x11ce14;
      fVar2 = fdb_set_kv(pfVar17,pfVar14,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_48b8 = (fdb_kvs_handle *)0x11d0a5;
        tx_crash_recover_test();
        goto LAB_0011d0a5;
      }
      uVar12 = (int)uVar20 + 1;
      uVar20 = (ulong)uVar12;
    } while (uVar12 != 10);
    pfStack_48b8 = (fdb_kvs_handle *)0x11ce31;
    fVar2 = fdb_end_transaction(pfStack_48b0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c3;
    pfStack_48b8 = (fdb_kvs_handle *)0x11ce49;
    fdb_compact(pfStack_48b0,"./mvcc_test3");
    pfStack_48b8 = (fdb_kvs_handle *)0x11ce57;
    fVar2 = fdb_begin_transaction(pfStack_48b0,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c8;
    pcVar13 = "key%d";
    pfVar14 = (fdb_kvs_handle *)acStack_489f;
    uVar12 = 0;
    do {
      pfStack_48b8 = (fdb_kvs_handle *)0x11ce7c;
      sprintf((char *)pfVar14,"key%d",(ulong)uVar12);
      pfVar23 = pfStack_48a8;
      pfStack_48b8 = (fdb_kvs_handle *)0x11ce89;
      sVar5 = strlen((char *)pfVar14);
      pfStack_48b8 = (fdb_kvs_handle *)0x11ce97;
      fVar2 = fdb_del_kv(pfVar23,pfVar14,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0a5;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 10);
    pfStack_48b8 = (fdb_kvs_handle *)0x11ceb4;
    fVar2 = fdb_get_file_info(pfStack_48b0,(fdb_file_info *)auStack_4848);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0cd;
    pcVar13 = (char *)((ulong)auStack_4848._40_8_ / (ulong)uStack_47fc);
    pfStack_48b8 = (fdb_kvs_handle *)0x11cedc;
    fdb_close(pfStack_48b0);
    pfStack_48b8 = (fdb_kvs_handle *)0x11cee1;
    fdb_shutdown();
    pfStack_48b8 = (fdb_kvs_handle *)0x11cf00;
    iVar3 = _disk_dump("./mvcc_test3",(ulong)uStack_47fc * (long)pcVar13,
                       (ulong)((uStack_47fc >> 2) + uStack_47fc * 2));
    if (iVar3 < 0) goto LAB_0011d0d2;
    pfStack_48b8 = (fdb_kvs_handle *)0x11cf2a;
    iVar3 = _disk_dump("./mvcc_test2",((long)pcVar13 * 4 + 8) * (ulong)uStack_47fc,
                       (ulong)(uStack_47fc >> 2));
    if (iVar3 < 0) goto LAB_0011d0d7;
    pfStack_48b8 = (fdb_kvs_handle *)0x11cf49;
    fVar2 = fdb_open(&pfStack_48b0,"./mvcc_test3",(fdb_config *)(auStack_4848 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0dc;
    pcVar13 = (char *)&pfStack_4890;
    pfStack_48b8 = (fdb_kvs_handle *)0x11cf5e;
    fdb_get_default_kvs_config();
    pbStack_4860 = pbStack_4880;
    pfStack_4870 = pfStack_4890;
    pdStack_4868 = pdStack_4888;
    pfStack_48b8 = (fdb_kvs_handle *)0x11cf7f;
    fVar2 = fdb_kvs_open_default(pfStack_48b0,&pfStack_48a8,(fdb_kvs_config *)&pfStack_4870);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0e1;
    pfStack_48b8 = (fdb_kvs_handle *)0x11cf95;
    fVar2 = fdb_begin_transaction(pfStack_48b0,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar12 = 0;
      do {
        pfStack_48b8 = (fdb_kvs_handle *)0x11cfba;
        sprintf(acStack_489f,"key%d",(ulong)uVar12);
        pfVar23 = pfStack_48a8;
        pfStack_48b8 = (fdb_kvs_handle *)0x11cfc7;
        sVar5 = strlen(acStack_489f);
        pfStack_48b8 = (fdb_kvs_handle *)0x11cfd5;
        fVar2 = fdb_del_kv(pfVar23,acStack_489f,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0aa;
        uVar12 = uVar12 + 1;
      } while (uVar12 != 10);
      pfStack_48b8 = (fdb_kvs_handle *)0x11cfed;
      fdb_abort_transaction(pfStack_48b0);
      pfVar23 = (fdb_kvs_handle *)&pfStack_4890;
      uVar12 = 0;
      while( true ) {
        pfStack_48b8 = (fdb_kvs_handle *)0x11d014;
        sprintf(acStack_489f,"key%d",(ulong)uVar12);
        pfVar14 = pfStack_48a8;
        pfStack_48b8 = (fdb_kvs_handle *)0x11d021;
        sVar5 = strlen(acStack_489f);
        pfStack_48b8 = (fdb_kvs_handle *)0x11d035;
        fVar2 = fdb_get_kv(pfVar14,acStack_489f,sVar5,(void **)pfVar23,&sStack_4878);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_48b8 = (fdb_kvs_handle *)0x11d043;
        free(pfStack_4890);
        uVar12 = uVar12 + 1;
        if (uVar12 == 10) {
          pfStack_48b8 = (fdb_kvs_handle *)0x11d053;
          fdb_close(pfStack_48b0);
          pfStack_48b8 = (fdb_kvs_handle *)0x11d058;
          fdb_shutdown();
          pfStack_48b8 = (fdb_kvs_handle *)0x11d05d;
          memleak_end();
          pcVar13 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar13 = "%s FAILED\n";
          }
          pfStack_48b8 = (fdb_kvs_handle *)0x11d08e;
          fprintf(_stderr,pcVar13,"crash recover test");
          return;
        }
      }
LAB_0011d0af:
      pfVar14 = (fdb_kvs_handle *)acStack_489f;
      pcVar13 = "key%d";
      pfStack_48b8 = (fdb_kvs_handle *)0x11d0b4;
      tx_crash_recover_test();
      goto LAB_0011d0b4;
    }
  }
  else {
LAB_0011d0b4:
    pfStack_48b8 = (fdb_kvs_handle *)0x11d0b9;
    tx_crash_recover_test();
LAB_0011d0b9:
    pfStack_48b8 = (fdb_kvs_handle *)0x11d0be;
    tx_crash_recover_test();
LAB_0011d0be:
    pfStack_48b8 = (fdb_kvs_handle *)0x11d0c3;
    tx_crash_recover_test();
LAB_0011d0c3:
    pfStack_48b8 = (fdb_kvs_handle *)0x11d0c8;
    tx_crash_recover_test();
LAB_0011d0c8:
    pfStack_48b8 = (fdb_kvs_handle *)0x11d0cd;
    tx_crash_recover_test();
LAB_0011d0cd:
    pfStack_48b8 = (fdb_kvs_handle *)0x11d0d2;
    tx_crash_recover_test();
LAB_0011d0d2:
    pfStack_48b8 = (fdb_kvs_handle *)0x11d0d7;
    tx_crash_recover_test();
LAB_0011d0d7:
    pfStack_48b8 = (fdb_kvs_handle *)0x11d0dc;
    tx_crash_recover_test();
LAB_0011d0dc:
    pfStack_48b8 = (fdb_kvs_handle *)0x11d0e1;
    tx_crash_recover_test();
LAB_0011d0e1:
    pfStack_48b8 = (fdb_kvs_handle *)0x11d0e6;
    tx_crash_recover_test();
  }
  pfStack_48b8 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_48c8 = (fdb_config *)pcVar13;
  pfStack_48c0 = pfVar14;
  pfStack_48b8 = pfVar23;
  gettimeofday(&tStack_49e8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_49f8 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_4a08,"./mvcc_test1",&fStack_49c0);
  fdb_kvs_open_default(pfStack_4a08,&pfStack_49f0,&fStack_49d8);
  fdb_kvs_open(pfStack_4a08,&pfStack_4a10,"kv",&fStack_49d8);
  fVar2 = fdb_set_kv(pfStack_4a10,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_4a10,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d304;
    fdb_commit(pfStack_4a08,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_4a10,&pfStack_4a18,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d30b;
    fVar2 = fdb_iterator_init(pfStack_4a18,&pfStack_4a00,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d310;
    fVar2 = fdb_kvs_close(pfStack_4a18);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d315;
    fVar2 = fdb_kvs_close(pfStack_4a10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d31a;
    fVar2 = fdb_kvs_remove(pfStack_4a08,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d31f;
    fVar2 = fdb_iterator_get(pfStack_4a00,&pfStack_49f8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d324;
    fdb_doc_free(pfStack_49f8);
    fVar2 = fdb_iterator_close(pfStack_4a00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d329;
    fVar2 = fdb_kvs_close(pfStack_4a18);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d32e;
    fVar2 = fdb_kvs_close(pfStack_49f0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_4a08);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar13 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar13 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar13,"drop kv other handle test");
        return;
      }
      goto LAB_0011d338;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d304:
    drop_kv_on_snap_iterator_test();
LAB_0011d30b:
    drop_kv_on_snap_iterator_test();
LAB_0011d310:
    drop_kv_on_snap_iterator_test();
LAB_0011d315:
    drop_kv_on_snap_iterator_test();
LAB_0011d31a:
    drop_kv_on_snap_iterator_test();
LAB_0011d31f:
    drop_kv_on_snap_iterator_test();
LAB_0011d324:
    drop_kv_on_snap_iterator_test();
LAB_0011d329:
    drop_kv_on_snap_iterator_test();
LAB_0011d32e:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d338:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void rollback_to_zero_after_compact_test(bool multi_kv)
{
    TEST_INIT();

    int i, r;
    const int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_kvs_handle *db[4]; // same as num_kvs
    fdb_file_handle *dbfile, *dbfile_comp;
    fdb_doc *doc[n];
    fdb_kvs_info info;
    fdb_status status;

    char keybuf[64], metabuf[64], bodybuf[64];
    char kv_name[8];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);

    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                         (void *) "rollback_to_zero_after_compact_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // open db
    status = fdb_open(&dbfile_comp, "./mvcc_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_compact(dbfile_comp, "./mvcc_test2");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile_comp);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_rollback(&db[r], 0);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_get_kvs_info(db[r], &info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(info.last_seqnum == 0);
        TEST_CHK(info.doc_count == 0);
        TEST_CHK(info.space_used == 0);
        status = fdb_get(db[r], doc[0]);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        // test normal operation after rollback
        status = fdb_set(db[r], doc[0]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // test normal operation after rollbacks manually flush WAL & commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    sprintf(bodybuf, "rollback to zero after compact test %s",
            multi_kv ? "multiple kv mode:" : "single kv mode:");
    TEST_RESULT(bodybuf);
}